

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  ulong uVar73;
  bool bVar74;
  Geometry *geometry;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  long lVar75;
  uint uVar76;
  ulong uVar77;
  byte bVar78;
  ulong uVar79;
  float fVar80;
  float fVar125;
  float fVar127;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar85 [16];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar131;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar132;
  undefined4 uVar133;
  undefined8 uVar134;
  float fVar139;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar140;
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar161 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_620 [16];
  ulong local_608;
  undefined1 local_600 [16];
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  RTCFilterFunctionNArguments local_5b0;
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  LinearSpace3fa *local_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_390 [16];
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined8 local_2c0;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  int local_23c;
  undefined1 local_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar178 [64];
  
  PVar12 = prim[1];
  uVar73 = (ulong)(byte)PVar12;
  fVar140 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar22 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar23 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  fVar145 = fVar140 * auVar23._0_4_;
  fVar132 = fVar140 * auVar22._0_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar92 = vpmovsxbd_avx2(auVar83);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar89 = vpmovsxbd_avx2(auVar82);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar186);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar91 = vpmovsxbd_avx2(auVar81);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar97 = vpmovsxbd_avx2(auVar8);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar94 = vcvtdq2ps_avx(auVar97);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar73 + 6);
  auVar93 = vpmovsxbd_avx2(auVar9);
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar77 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar95 = vpmovsxbd_avx2(auVar10);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar77 + uVar73 + 6);
  auVar103 = vpmovsxbd_avx2(auVar11);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar79 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar88 = vpmovsxbd_avx2(auVar84);
  auVar96 = vcvtdq2ps_avx(auVar88);
  auVar174._4_4_ = fVar132;
  auVar174._0_4_ = fVar132;
  auVar174._8_4_ = fVar132;
  auVar174._12_4_ = fVar132;
  auVar174._16_4_ = fVar132;
  auVar174._20_4_ = fVar132;
  auVar174._24_4_ = fVar132;
  auVar174._28_4_ = fVar132;
  auVar179._8_4_ = 1;
  auVar179._0_8_ = 0x100000001;
  auVar179._12_4_ = 1;
  auVar179._16_4_ = 1;
  auVar179._20_4_ = 1;
  auVar179._24_4_ = 1;
  auVar179._28_4_ = 1;
  auVar86 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = ZEXT1632(CONCAT412(fVar140 * auVar22._12_4_,
                               CONCAT48(fVar140 * auVar22._8_4_,
                                        CONCAT44(fVar140 * auVar22._4_4_,fVar132))));
  auVar98 = vpermps_avx2(auVar179,auVar99);
  auVar87 = vpermps_avx512vl(auVar86,auVar99);
  fVar132 = auVar87._0_4_;
  fVar146 = auVar87._4_4_;
  auVar99._4_4_ = fVar146 * auVar90._4_4_;
  auVar99._0_4_ = fVar132 * auVar90._0_4_;
  fVar139 = auVar87._8_4_;
  auVar99._8_4_ = fVar139 * auVar90._8_4_;
  fVar160 = auVar87._12_4_;
  auVar99._12_4_ = fVar160 * auVar90._12_4_;
  fVar163 = auVar87._16_4_;
  auVar99._16_4_ = fVar163 * auVar90._16_4_;
  fVar159 = auVar87._20_4_;
  auVar99._20_4_ = fVar159 * auVar90._20_4_;
  fVar162 = auVar87._24_4_;
  auVar99._24_4_ = fVar162 * auVar90._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar93._4_4_ * fVar146;
  auVar97._0_4_ = auVar93._0_4_ * fVar132;
  auVar97._8_4_ = auVar93._8_4_ * fVar139;
  auVar97._12_4_ = auVar93._12_4_ * fVar160;
  auVar97._16_4_ = auVar93._16_4_ * fVar163;
  auVar97._20_4_ = auVar93._20_4_ * fVar159;
  auVar97._24_4_ = auVar93._24_4_ * fVar162;
  auVar97._28_4_ = auVar88._28_4_;
  auVar88._4_4_ = auVar96._4_4_ * fVar146;
  auVar88._0_4_ = auVar96._0_4_ * fVar132;
  auVar88._8_4_ = auVar96._8_4_ * fVar139;
  auVar88._12_4_ = auVar96._12_4_ * fVar160;
  auVar88._16_4_ = auVar96._16_4_ * fVar163;
  auVar88._20_4_ = auVar96._20_4_ * fVar159;
  auVar88._24_4_ = auVar96._24_4_ * fVar162;
  auVar88._28_4_ = auVar87._28_4_;
  auVar83 = vfmadd231ps_fma(auVar99,auVar98,auVar89);
  auVar82 = vfmadd231ps_fma(auVar97,auVar98,auVar94);
  auVar186 = vfmadd231ps_fma(auVar88,auVar103,auVar98);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar174,auVar92);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar174,auVar91);
  auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar95,auVar174);
  auVar175._4_4_ = fVar145;
  auVar175._0_4_ = fVar145;
  auVar175._8_4_ = fVar145;
  auVar175._12_4_ = fVar145;
  auVar175._16_4_ = fVar145;
  auVar175._20_4_ = fVar145;
  auVar175._24_4_ = fVar145;
  auVar175._28_4_ = fVar145;
  auVar88 = ZEXT1632(CONCAT412(fVar140 * auVar23._12_4_,
                               CONCAT48(fVar140 * auVar23._8_4_,
                                        CONCAT44(fVar140 * auVar23._4_4_,fVar145))));
  auVar97 = vpermps_avx2(auVar179,auVar88);
  auVar88 = vpermps_avx512vl(auVar86,auVar88);
  fVar140 = auVar88._0_4_;
  fVar132 = auVar88._4_4_;
  auVar98._4_4_ = fVar132 * auVar90._4_4_;
  auVar98._0_4_ = fVar140 * auVar90._0_4_;
  fVar146 = auVar88._8_4_;
  auVar98._8_4_ = fVar146 * auVar90._8_4_;
  fVar139 = auVar88._12_4_;
  auVar98._12_4_ = fVar139 * auVar90._12_4_;
  fVar160 = auVar88._16_4_;
  auVar98._16_4_ = fVar160 * auVar90._16_4_;
  fVar163 = auVar88._20_4_;
  auVar98._20_4_ = fVar163 * auVar90._20_4_;
  fVar159 = auVar88._24_4_;
  auVar98._24_4_ = fVar159 * auVar90._24_4_;
  auVar98._28_4_ = 1;
  auVar86._4_4_ = auVar93._4_4_ * fVar132;
  auVar86._0_4_ = auVar93._0_4_ * fVar140;
  auVar86._8_4_ = auVar93._8_4_ * fVar146;
  auVar86._12_4_ = auVar93._12_4_ * fVar139;
  auVar86._16_4_ = auVar93._16_4_ * fVar160;
  auVar86._20_4_ = auVar93._20_4_ * fVar163;
  auVar86._24_4_ = auVar93._24_4_ * fVar159;
  auVar86._28_4_ = auVar90._28_4_;
  auVar93._4_4_ = auVar96._4_4_ * fVar132;
  auVar93._0_4_ = auVar96._0_4_ * fVar140;
  auVar93._8_4_ = auVar96._8_4_ * fVar146;
  auVar93._12_4_ = auVar96._12_4_ * fVar139;
  auVar93._16_4_ = auVar96._16_4_ * fVar160;
  auVar93._20_4_ = auVar96._20_4_ * fVar163;
  auVar93._24_4_ = auVar96._24_4_ * fVar159;
  auVar93._28_4_ = auVar88._28_4_;
  auVar81 = vfmadd231ps_fma(auVar98,auVar97,auVar89);
  auVar8 = vfmadd231ps_fma(auVar86,auVar97,auVar94);
  auVar9 = vfmadd231ps_fma(auVar93,auVar97,auVar103);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar175,auVar92);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar175,auVar91);
  auVar165._8_4_ = 0x7fffffff;
  auVar165._0_8_ = 0x7fffffff7fffffff;
  auVar165._12_4_ = 0x7fffffff;
  auVar165._16_4_ = 0x7fffffff;
  auVar165._20_4_ = 0x7fffffff;
  auVar165._24_4_ = 0x7fffffff;
  auVar165._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar175,auVar95);
  auVar92 = vandps_avx(ZEXT1632(auVar83),auVar165);
  auVar161._8_4_ = 0x219392ef;
  auVar161._0_8_ = 0x219392ef219392ef;
  auVar161._12_4_ = 0x219392ef;
  auVar161._16_4_ = 0x219392ef;
  auVar161._20_4_ = 0x219392ef;
  auVar161._24_4_ = 0x219392ef;
  auVar161._28_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar92,auVar161,1);
  bVar74 = (bool)((byte)uVar77 & 1);
  auVar87._0_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._0_4_;
  bVar74 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._4_4_;
  bVar74 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._8_4_;
  bVar74 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar82),auVar165);
  uVar77 = vcmpps_avx512vl(auVar92,auVar161,1);
  bVar74 = (bool)((byte)uVar77 & 1);
  auVar100._0_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._0_4_;
  bVar74 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._4_4_;
  bVar74 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._8_4_;
  bVar74 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar186),auVar165);
  uVar77 = vcmpps_avx512vl(auVar92,auVar161,1);
  bVar74 = (bool)((byte)uVar77 & 1);
  auVar92._0_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar186._0_4_;
  bVar74 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar186._4_4_;
  bVar74 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar186._8_4_;
  bVar74 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar186._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar89 = vrcp14ps_avx512vl(auVar87);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar91 = vfnmadd213ps_avx512vl(auVar87,auVar89,auVar90);
  auVar83 = vfmadd132ps_fma(auVar91,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar100);
  auVar91 = vfnmadd213ps_avx512vl(auVar100,auVar89,auVar90);
  auVar82 = vfmadd132ps_fma(auVar91,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar92);
  auVar92 = vfnmadd213ps_avx512vl(auVar92,auVar89,auVar90);
  auVar186 = vfmadd132ps_fma(auVar92,auVar89,auVar89);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar81));
  auVar95._4_4_ = auVar83._4_4_ * auVar92._4_4_;
  auVar95._0_4_ = auVar83._0_4_ * auVar92._0_4_;
  auVar95._8_4_ = auVar83._8_4_ * auVar92._8_4_;
  auVar95._12_4_ = auVar83._12_4_ * auVar92._12_4_;
  auVar95._16_4_ = auVar92._16_4_ * 0.0;
  auVar95._20_4_ = auVar92._20_4_ * 0.0;
  auVar95._24_4_ = auVar92._24_4_ * 0.0;
  auVar95._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar81));
  auVar93 = vpbroadcastd_avx512vl();
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar143._0_4_ = auVar83._0_4_ * auVar92._0_4_;
  auVar143._4_4_ = auVar83._4_4_ * auVar92._4_4_;
  auVar143._8_4_ = auVar83._8_4_ * auVar92._8_4_;
  auVar143._12_4_ = auVar83._12_4_ * auVar92._12_4_;
  auVar143._16_4_ = auVar92._16_4_ * 0.0;
  auVar143._20_4_ = auVar92._20_4_ * 0.0;
  auVar143._24_4_ = auVar92._24_4_ * 0.0;
  auVar143._28_4_ = 0;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar12 * 0x10 + uVar73 * -2 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar8));
  auVar103._4_4_ = auVar82._4_4_ * auVar92._4_4_;
  auVar103._0_4_ = auVar82._0_4_ * auVar92._0_4_;
  auVar103._8_4_ = auVar82._8_4_ * auVar92._8_4_;
  auVar103._12_4_ = auVar82._12_4_ * auVar92._12_4_;
  auVar103._16_4_ = auVar92._16_4_ * 0.0;
  auVar103._20_4_ = auVar92._20_4_ * 0.0;
  auVar103._24_4_ = auVar92._24_4_ * 0.0;
  auVar103._28_4_ = auVar92._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar89);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar8));
  auVar102._0_4_ = auVar82._0_4_ * auVar92._0_4_;
  auVar102._4_4_ = auVar82._4_4_ * auVar92._4_4_;
  auVar102._8_4_ = auVar82._8_4_ * auVar92._8_4_;
  auVar102._12_4_ = auVar82._12_4_ * auVar92._12_4_;
  auVar102._16_4_ = auVar92._16_4_ * 0.0;
  auVar102._20_4_ = auVar92._20_4_ * 0.0;
  auVar102._24_4_ = auVar92._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 + uVar73 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar9));
  auVar96._4_4_ = auVar92._4_4_ * auVar186._4_4_;
  auVar96._0_4_ = auVar92._0_4_ * auVar186._0_4_;
  auVar96._8_4_ = auVar92._8_4_ * auVar186._8_4_;
  auVar96._12_4_ = auVar92._12_4_ * auVar186._12_4_;
  auVar96._16_4_ = auVar92._16_4_ * 0.0;
  auVar96._20_4_ = auVar92._20_4_ * 0.0;
  auVar96._24_4_ = auVar92._24_4_ * 0.0;
  auVar96._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x17 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar9));
  auVar101._0_4_ = auVar186._0_4_ * auVar92._0_4_;
  auVar101._4_4_ = auVar186._4_4_ * auVar92._4_4_;
  auVar101._8_4_ = auVar186._8_4_ * auVar92._8_4_;
  auVar101._12_4_ = auVar186._12_4_ * auVar92._12_4_;
  auVar101._16_4_ = auVar92._16_4_ * 0.0;
  auVar101._20_4_ = auVar92._20_4_ * 0.0;
  auVar101._24_4_ = auVar92._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar92 = vpminsd_avx2(auVar95,auVar143);
  auVar89 = vpminsd_avx2(auVar103,auVar102);
  auVar92 = vmaxps_avx(auVar92,auVar89);
  auVar89 = vpminsd_avx2(auVar96,auVar101);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar90._4_4_ = uVar133;
  auVar90._0_4_ = uVar133;
  auVar90._8_4_ = uVar133;
  auVar90._12_4_ = uVar133;
  auVar90._16_4_ = uVar133;
  auVar90._20_4_ = uVar133;
  auVar90._24_4_ = uVar133;
  auVar90._28_4_ = uVar133;
  auVar89 = vmaxps_avx512vl(auVar89,auVar90);
  auVar92 = vmaxps_avx(auVar92,auVar89);
  auVar89._8_4_ = 0x3f7ffffa;
  auVar89._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar89._12_4_ = 0x3f7ffffa;
  auVar89._16_4_ = 0x3f7ffffa;
  auVar89._20_4_ = 0x3f7ffffa;
  auVar89._24_4_ = 0x3f7ffffa;
  auVar89._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar92,auVar89);
  auVar92 = vpmaxsd_avx2(auVar95,auVar143);
  auVar89 = vpmaxsd_avx2(auVar103,auVar102);
  auVar92 = vminps_avx(auVar92,auVar89);
  auVar89 = vpmaxsd_avx2(auVar96,auVar101);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar91._4_4_ = uVar133;
  auVar91._0_4_ = uVar133;
  auVar91._8_4_ = uVar133;
  auVar91._12_4_ = uVar133;
  auVar91._16_4_ = uVar133;
  auVar91._20_4_ = uVar133;
  auVar91._24_4_ = uVar133;
  auVar91._28_4_ = uVar133;
  auVar89 = vminps_avx512vl(auVar89,auVar91);
  auVar92 = vminps_avx(auVar92,auVar89);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar94);
  uVar24 = vpcmpgtd_avx512vl(auVar93,_DAT_01fe9900);
  uVar134 = vcmpps_avx512vl(local_80,auVar92,2);
  if ((byte)((byte)uVar134 & (byte)uVar24) == 0) {
    bVar74 = false;
  }
  else {
    uVar77 = (ulong)(byte)((byte)uVar134 & (byte)uVar24);
    local_468 = pre->ray_space + k;
    local_390 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar25 = 0;
      for (uVar79 = uVar77; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_608 = (ulong)*(uint *)(prim + 2);
      pGVar14 = (context->scene->geometries).items[local_608].ptr;
      local_540._0_8_ = CONCAT44(0,*(uint *)(prim + lVar25 * 4 + 6));
      uVar79 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                               pGVar14[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               CONCAT44(0,*(uint *)(prim + lVar25 * 4 + 6)));
      p_Var15 = pGVar14[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar14[1].time_range.upper;
      local_600 = *(undefined1 (*) [16])(lVar25 + (long)p_Var15 * uVar79);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar79 + 1) * (long)p_Var15);
      local_5e0 = *(undefined8 *)*pauVar3;
      uStack_5d8 = *(undefined8 *)(*pauVar3 + 8);
      auVar83 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar25 + (uVar79 + 2) * (long)p_Var15);
      local_5f0 = *(undefined8 *)*pauVar4;
      uStack_5e8 = *(undefined8 *)(*pauVar4 + 8);
      auVar82 = *pauVar4;
      uVar77 = uVar77 - 1 & uVar77;
      pauVar5 = (undefined1 (*) [12])(lVar25 + (uVar79 + 3) * (long)p_Var15);
      local_530 = (float)*(undefined8 *)*pauVar5;
      fStack_52c = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
      fStack_528 = (float)*(undefined8 *)(*pauVar5 + 8);
      fStack_524 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
      if (uVar77 != 0) {
        uVar73 = uVar77 - 1 & uVar77;
        for (uVar79 = uVar77; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
        }
        if (uVar73 != 0) {
          for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar186 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar186 = vinsertps_avx(auVar186,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar8 = vsubps_avx(local_600,auVar186);
      uVar133 = auVar8._0_4_;
      auVar142._4_4_ = uVar133;
      auVar142._0_4_ = uVar133;
      auVar142._8_4_ = uVar133;
      auVar142._12_4_ = uVar133;
      auVar81 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      aVar6 = (local_468->vx).field_0;
      aVar7 = (local_468->vy).field_0;
      fVar140 = (local_468->vz).field_0.m128[0];
      fVar132 = *(float *)((long)&(local_468->vz).field_0 + 4);
      fVar146 = *(float *)((long)&(local_468->vz).field_0 + 8);
      fVar139 = *(float *)((long)&(local_468->vz).field_0 + 0xc);
      auVar168._0_4_ = fVar140 * auVar8._0_4_;
      auVar168._4_4_ = fVar132 * auVar8._4_4_;
      auVar168._8_4_ = fVar146 * auVar8._8_4_;
      auVar168._12_4_ = fVar139 * auVar8._12_4_;
      auVar81 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar7,auVar81);
      auVar10 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar6,auVar142);
      auVar81 = vshufps_avx(local_600,local_600,0xff);
      auVar9 = vsubps_avx(auVar83,auVar186);
      uVar133 = auVar9._0_4_;
      auVar85._4_4_ = uVar133;
      auVar85._0_4_ = uVar133;
      auVar85._8_4_ = uVar133;
      auVar85._12_4_ = uVar133;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar169._0_4_ = fVar140 * auVar9._0_4_;
      auVar169._4_4_ = fVar132 * auVar9._4_4_;
      auVar169._8_4_ = fVar146 * auVar9._8_4_;
      auVar169._12_4_ = fVar139 * auVar9._12_4_;
      auVar8 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar7,auVar8);
      auVar11 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar85);
      auVar83 = vshufps_avx(auVar83,auVar83,0xff);
      auVar9 = vsubps_avx(auVar82,auVar186);
      uVar133 = auVar9._0_4_;
      auVar164._4_4_ = uVar133;
      auVar164._0_4_ = uVar133;
      auVar164._8_4_ = uVar133;
      auVar164._12_4_ = uVar133;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar171._0_4_ = fVar140 * auVar9._0_4_;
      auVar171._4_4_ = fVar132 * auVar9._4_4_;
      auVar171._8_4_ = fVar146 * auVar9._8_4_;
      auVar171._12_4_ = fVar139 * auVar9._12_4_;
      auVar8 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar7,auVar8);
      auVar9 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar164);
      auVar82 = vshufps_avx(auVar82,auVar82,0xff);
      auVar22._12_4_ = fStack_524;
      auVar22._0_12_ = *pauVar5;
      auVar8 = vsubps_avx(auVar22,auVar186);
      uVar133 = auVar8._0_4_;
      auVar147._4_4_ = uVar133;
      auVar147._0_4_ = uVar133;
      auVar147._8_4_ = uVar133;
      auVar147._12_4_ = uVar133;
      auVar186 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      auVar172._0_4_ = fVar140 * auVar8._0_4_;
      auVar172._4_4_ = fVar132 * auVar8._4_4_;
      auVar172._8_4_ = fVar146 * auVar8._8_4_;
      auVar172._12_4_ = fVar139 * auVar8._12_4_;
      auVar186 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar7,auVar186);
      auVar8 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar147);
      lVar25 = (long)iVar13 * 0x44;
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      auVar186 = vshufps_avx(auVar22,auVar22,0xff);
      local_3c0 = vbroadcastss_avx512vl(auVar10);
      auVar150._8_4_ = 1;
      auVar150._0_8_ = 0x100000001;
      auVar150._12_4_ = 1;
      auVar150._16_4_ = 1;
      auVar150._20_4_ = 1;
      auVar150._24_4_ = 1;
      auVar150._28_4_ = 1;
      local_3e0 = vpermps_avx512vl(auVar150,ZEXT1632(auVar10));
      uVar134 = auVar81._0_8_;
      local_a0._8_8_ = uVar134;
      local_a0._0_8_ = uVar134;
      local_a0._16_8_ = uVar134;
      local_a0._24_8_ = uVar134;
      auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      uVar133 = auVar11._0_4_;
      local_440._4_4_ = uVar133;
      local_440._0_4_ = uVar133;
      local_440._8_4_ = uVar133;
      local_440._12_4_ = uVar133;
      local_440._16_4_ = uVar133;
      local_440._20_4_ = uVar133;
      local_440._24_4_ = uVar133;
      local_440._28_4_ = uVar133;
      local_400 = vpermps_avx512vl(auVar150,ZEXT1632(auVar11));
      local_c0 = vbroadcastsd_avx512vl(auVar83);
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      uVar133 = auVar9._0_4_;
      local_580._4_4_ = uVar133;
      local_580._0_4_ = uVar133;
      local_580._8_4_ = uVar133;
      local_580._12_4_ = uVar133;
      local_580._16_4_ = uVar133;
      local_580._20_4_ = uVar133;
      local_580._24_4_ = uVar133;
      local_580._28_4_ = uVar133;
      local_4c0 = vpermps_avx512vl(auVar150,ZEXT1632(auVar9));
      auVar188 = ZEXT3264(local_4c0);
      local_e0 = vbroadcastsd_avx512vl(auVar82);
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0xd8c);
      local_4e0 = vbroadcastss_avx512vl(auVar8);
      auVar191 = ZEXT3264(local_4e0);
      local_500 = vpermps_avx512vl(auVar150,ZEXT1632(auVar8));
      auVar189 = ZEXT3264(local_500);
      uVar134 = auVar186._0_8_;
      register0x000012c8 = uVar134;
      local_100 = uVar134;
      register0x000012d0 = uVar134;
      register0x000012d8 = uVar134;
      auVar94 = vmulps_avx512vl(local_4e0,auVar91);
      auVar93 = vmulps_avx512vl(local_500,auVar91);
      auVar83 = vfmadd231ps_fma(auVar94,auVar90,local_580);
      auVar94 = vfmadd231ps_avx512vl(auVar93,auVar90,local_4c0);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar89,local_440);
      auVar95 = vfmadd231ps_avx512vl(auVar94,auVar89,local_400);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar92,local_3c0);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar97 = vfmadd231ps_avx512vl(auVar95,auVar92,local_3e0);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0xd8c);
      auVar88 = vmulps_avx512vl(local_4e0,auVar103);
      auVar98 = vmulps_avx512vl(local_500,auVar103);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,local_580);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_4c0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,local_440);
      auVar192 = ZEXT3264(local_400);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_400);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,local_3c0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_3e0);
      auVar99 = vsubps_avx512vl(auVar88,auVar96);
      auVar86 = vsubps_avx512vl(auVar98,auVar97);
      auVar87 = vmulps_avx512vl(auVar97,auVar99);
      auVar100 = vmulps_avx512vl(auVar96,auVar86);
      auVar87 = vsubps_avx512vl(auVar87,auVar100);
      auVar100 = vmulps_avx512vl(_local_100,auVar91);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,local_e0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar89,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,local_a0);
      auVar101 = vmulps_avx512vl(_local_100,auVar103);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,local_e0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,local_c0);
      auVar186 = vfmadd231ps_fma(auVar101,auVar94,local_a0);
      auVar101 = vmulps_avx512vl(auVar86,auVar86);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar99);
      auVar102 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar186));
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      auVar101 = vmulps_avx512vl(auVar102,auVar101);
      auVar87 = vmulps_avx512vl(auVar87,auVar87);
      uVar134 = vcmpps_avx512vl(auVar87,auVar101,2);
      auVar83 = vblendps_avx(auVar10,local_600,8);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar82 = vandps_avx512vl(auVar83,auVar81);
      auVar83 = vblendps_avx(auVar11,*pauVar3,8);
      auVar83 = vandps_avx512vl(auVar83,auVar81);
      auVar82 = vmaxps_avx(auVar82,auVar83);
      auVar83 = vblendps_avx(auVar9,*pauVar4,8);
      auVar84 = vandps_avx512vl(auVar83,auVar81);
      auVar23._12_4_ = fStack_524;
      auVar23._0_12_ = *pauVar5;
      auVar83 = vblendps_avx(auVar8,auVar23,8);
      auVar83 = vandps_avx512vl(auVar83,auVar81);
      auVar83 = vmaxps_avx(auVar84,auVar83);
      auVar83 = vmaxps_avx(auVar82,auVar83);
      auVar82 = vmovshdup_avx(auVar83);
      auVar82 = vmaxss_avx(auVar82,auVar83);
      auVar83 = vshufpd_avx(auVar83,auVar83,1);
      auVar83 = vmaxss_avx(auVar83,auVar82);
      local_550._0_4_ = (undefined4)iVar13;
      local_550._4_12_ = auVar10._4_12_;
      auVar173._4_4_ = local_550._0_4_;
      auVar173._0_4_ = local_550._0_4_;
      auVar173._8_4_ = local_550._0_4_;
      auVar173._12_4_ = local_550._0_4_;
      auVar173._16_4_ = local_550._0_4_;
      auVar173._20_4_ = local_550._0_4_;
      auVar173._24_4_ = local_550._0_4_;
      auVar173._28_4_ = local_550._0_4_;
      uVar24 = vcmpps_avx512vl(auVar173,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar134 & (byte)uVar24;
      fVar132 = auVar83._0_4_ * 4.7683716e-07;
      auVar151._8_4_ = 2;
      auVar151._0_8_ = 0x200000002;
      auVar151._12_4_ = 2;
      auVar151._16_4_ = 2;
      auVar151._20_4_ = 2;
      auVar151._24_4_ = 2;
      auVar151._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar151,ZEXT1632(auVar10));
      local_140 = vpermps_avx512vl(auVar151,ZEXT1632(auVar11));
      local_160 = vpermps_avx512vl(auVar151,ZEXT1632(auVar9));
      local_4a0 = vpermps_avx2(auVar151,ZEXT1632(auVar8));
      fVar140 = *(float *)(ray + k * 4 + 0x30);
      auVar83 = auVar86._0_16_;
      if (bVar78 == 0) {
        bVar74 = false;
        auVar83 = vxorps_avx512vl(auVar83,auVar83);
        auVar187 = ZEXT1664(auVar83);
        auVar183 = ZEXT3264(local_3c0);
        auVar184 = ZEXT3264(local_3e0);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar190 = ZEXT3264(auVar92);
        auVar185 = ZEXT3264(local_440);
        auVar182 = ZEXT3264(local_580);
      }
      else {
        fStack_45c = 0.0;
        fStack_458 = 0.0;
        fStack_454 = 0.0;
        auVar103 = vmulps_avx512vl(local_4a0,auVar103);
        auVar95 = vfmadd213ps_avx512vl(auVar95,local_160,auVar103);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar95);
        auVar93 = vfmadd213ps_avx512vl(auVar94,local_120,auVar93);
        auVar91 = vmulps_avx512vl(local_4a0,auVar91);
        auVar90 = vfmadd213ps_avx512vl(auVar90,local_160,auVar91);
        auVar95 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
        auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1f9c);
        auVar95 = vfmadd213ps_avx512vl(auVar92,local_120,auVar95);
        auVar92 = vmulps_avx512vl(local_4e0,auVar94);
        auVar103 = vmulps_avx512vl(local_500,auVar94);
        auVar94 = vmulps_avx512vl(local_4a0,auVar94);
        auVar182 = ZEXT3264(local_580);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,local_580);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar91,local_4c0);
        auVar91 = vfmadd231ps_avx512vl(auVar94,local_160,auVar91);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,local_440);
        auVar94 = vfmadd231ps_avx512vl(auVar103,auVar90,local_400);
        auVar103 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
        auVar82 = vfmadd231ps_fma(auVar92,auVar89,local_3c0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,local_3e0);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1f9c);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_120,auVar89);
        auVar89 = vmulps_avx512vl(local_4e0,auVar91);
        auVar87 = vmulps_avx512vl(local_500,auVar91);
        auVar91 = vmulps_avx512vl(local_4a0,auVar91);
        auVar101 = vfmadd231ps_avx512vl(auVar89,auVar90,local_580);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,local_4c0);
        auVar90 = vfmadd231ps_avx512vl(auVar91,local_160,auVar90);
        auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar91 = vfmadd231ps_avx512vl(auVar101,auVar89,local_440);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,local_400);
        auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
        auVar81 = vfmadd231ps_fma(auVar91,auVar92,local_3c0);
        auVar90 = vfmadd231ps_avx512vl(auVar87,auVar92,local_3e0);
        auVar91 = vfmadd231ps_avx512vl(auVar89,local_120,auVar92);
        auVar180._8_4_ = 0x7fffffff;
        auVar180._0_8_ = 0x7fffffff7fffffff;
        auVar180._12_4_ = 0x7fffffff;
        auVar180._16_4_ = 0x7fffffff;
        auVar180._20_4_ = 0x7fffffff;
        auVar180._24_4_ = 0x7fffffff;
        auVar180._28_4_ = 0x7fffffff;
        auVar92 = vandps_avx(ZEXT1632(auVar82),auVar180);
        auVar89 = vandps_avx(auVar94,auVar180);
        auVar89 = vmaxps_avx(auVar92,auVar89);
        auVar92 = vandps_avx(auVar103,auVar180);
        auVar92 = vmaxps_avx(auVar89,auVar92);
        local_520._0_16_ = ZEXT416((uint)fVar132);
        auVar103 = vbroadcastss_avx512vl(ZEXT416((uint)fVar132));
        uVar79 = vcmpps_avx512vl(auVar92,auVar103,1);
        bVar74 = (bool)((byte)uVar79 & 1);
        auVar104._0_4_ = (float)((uint)bVar74 * auVar99._0_4_ | (uint)!bVar74 * auVar82._0_4_);
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar74 * auVar99._4_4_ | (uint)!bVar74 * auVar82._4_4_);
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar74 * auVar99._8_4_ | (uint)!bVar74 * auVar82._8_4_);
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar74 * auVar99._12_4_ | (uint)!bVar74 * auVar82._12_4_);
        fVar139 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar99._16_4_);
        auVar104._16_4_ = fVar139;
        fVar146 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar99._20_4_);
        auVar104._20_4_ = fVar146;
        fVar160 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar99._24_4_);
        auVar104._24_4_ = fVar160;
        uVar76 = (uint)(byte)(uVar79 >> 7) * auVar99._28_4_;
        auVar104._28_4_ = uVar76;
        bVar74 = (bool)((byte)uVar79 & 1);
        auVar105._0_4_ = (float)((uint)bVar74 * auVar86._0_4_ | (uint)!bVar74 * auVar94._0_4_);
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar74 * auVar86._4_4_ | (uint)!bVar74 * auVar94._4_4_);
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar74 * auVar86._8_4_ | (uint)!bVar74 * auVar94._8_4_);
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar74 * auVar86._12_4_ | (uint)!bVar74 * auVar94._12_4_);
        bVar74 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar74 * auVar86._16_4_ | (uint)!bVar74 * auVar94._16_4_);
        bVar74 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar74 * auVar86._20_4_ | (uint)!bVar74 * auVar94._20_4_);
        bVar74 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar74 * auVar86._24_4_ | (uint)!bVar74 * auVar94._24_4_);
        bVar74 = SUB81(uVar79 >> 7,0);
        auVar105._28_4_ = (uint)bVar74 * auVar86._28_4_ | (uint)!bVar74 * auVar94._28_4_;
        auVar92 = vandps_avx(auVar180,ZEXT1632(auVar81));
        auVar89 = vandps_avx(auVar90,auVar180);
        auVar89 = vmaxps_avx(auVar92,auVar89);
        auVar92 = vandps_avx(auVar91,auVar180);
        auVar92 = vmaxps_avx(auVar89,auVar92);
        uVar79 = vcmpps_avx512vl(auVar92,auVar103,1);
        bVar74 = (bool)((byte)uVar79 & 1);
        auVar106._0_4_ = (float)((uint)bVar74 * auVar99._0_4_ | (uint)!bVar74 * auVar81._0_4_);
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar74 * auVar99._4_4_ | (uint)!bVar74 * auVar81._4_4_);
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar74 * auVar99._8_4_ | (uint)!bVar74 * auVar81._8_4_);
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar74 * auVar99._12_4_ | (uint)!bVar74 * auVar81._12_4_);
        fVar163 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar99._16_4_);
        auVar106._16_4_ = fVar163;
        fVar159 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar99._20_4_);
        auVar106._20_4_ = fVar159;
        fVar162 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar99._24_4_);
        auVar106._24_4_ = fVar162;
        auVar106._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar99._28_4_;
        bVar74 = (bool)((byte)uVar79 & 1);
        auVar107._0_4_ = (float)((uint)bVar74 * auVar86._0_4_ | (uint)!bVar74 * auVar90._0_4_);
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar74 * auVar86._4_4_ | (uint)!bVar74 * auVar90._4_4_);
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar74 * auVar86._8_4_ | (uint)!bVar74 * auVar90._8_4_);
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar74 * auVar86._12_4_ | (uint)!bVar74 * auVar90._12_4_);
        bVar74 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar74 * auVar86._16_4_ | (uint)!bVar74 * auVar90._16_4_);
        bVar74 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar74 * auVar86._20_4_ | (uint)!bVar74 * auVar90._20_4_);
        bVar74 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar74 * auVar86._24_4_ | (uint)!bVar74 * auVar90._24_4_);
        bVar74 = SUB81(uVar79 >> 7,0);
        auVar107._28_4_ = (uint)bVar74 * auVar86._28_4_ | (uint)!bVar74 * auVar90._28_4_;
        auVar85 = vxorps_avx512vl(auVar83,auVar83);
        auVar187 = ZEXT1664(auVar85);
        auVar92 = vfmadd213ps_avx512vl(auVar104,auVar104,ZEXT1632(auVar85));
        auVar83 = vfmadd231ps_fma(auVar92,auVar105,auVar105);
        auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        fVar145 = auVar92._0_4_;
        fVar80 = auVar92._4_4_;
        fVar125 = auVar92._8_4_;
        fVar126 = auVar92._12_4_;
        fVar127 = auVar92._16_4_;
        fVar128 = auVar92._20_4_;
        fVar129 = auVar92._24_4_;
        auVar32._4_4_ = fVar80 * fVar80 * fVar80 * auVar83._4_4_ * -0.5;
        auVar32._0_4_ = fVar145 * fVar145 * fVar145 * auVar83._0_4_ * -0.5;
        auVar32._8_4_ = fVar125 * fVar125 * fVar125 * auVar83._8_4_ * -0.5;
        auVar32._12_4_ = fVar126 * fVar126 * fVar126 * auVar83._12_4_ * -0.5;
        auVar32._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar32._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar32._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar32._28_4_ = 0;
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar90 = vfmadd231ps_avx512vl(auVar32,auVar89,auVar92);
        auVar33._4_4_ = auVar105._4_4_ * auVar90._4_4_;
        auVar33._0_4_ = auVar105._0_4_ * auVar90._0_4_;
        auVar33._8_4_ = auVar105._8_4_ * auVar90._8_4_;
        auVar33._12_4_ = auVar105._12_4_ * auVar90._12_4_;
        auVar33._16_4_ = auVar105._16_4_ * auVar90._16_4_;
        auVar33._20_4_ = auVar105._20_4_ * auVar90._20_4_;
        auVar33._24_4_ = auVar105._24_4_ * auVar90._24_4_;
        auVar33._28_4_ = auVar92._28_4_;
        auVar34._4_4_ = auVar90._4_4_ * -auVar104._4_4_;
        auVar34._0_4_ = auVar90._0_4_ * -auVar104._0_4_;
        auVar34._8_4_ = auVar90._8_4_ * -auVar104._8_4_;
        auVar34._12_4_ = auVar90._12_4_ * -auVar104._12_4_;
        auVar34._16_4_ = auVar90._16_4_ * -fVar139;
        auVar34._20_4_ = auVar90._20_4_ * -fVar146;
        auVar34._24_4_ = auVar90._24_4_ * -fVar160;
        auVar34._28_4_ = uVar76 ^ 0x80000000;
        auVar92 = vmulps_avx512vl(auVar90,ZEXT1632(auVar85));
        auVar99 = ZEXT1632(auVar85);
        auVar91 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar99);
        auVar83 = vfmadd231ps_fma(auVar91,auVar107,auVar107);
        auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        fVar146 = auVar91._0_4_;
        fVar139 = auVar91._4_4_;
        fVar160 = auVar91._8_4_;
        fVar145 = auVar91._12_4_;
        fVar80 = auVar91._16_4_;
        fVar125 = auVar91._20_4_;
        fVar126 = auVar91._24_4_;
        auVar35._4_4_ = fVar139 * fVar139 * fVar139 * auVar83._4_4_ * -0.5;
        auVar35._0_4_ = fVar146 * fVar146 * fVar146 * auVar83._0_4_ * -0.5;
        auVar35._8_4_ = fVar160 * fVar160 * fVar160 * auVar83._8_4_ * -0.5;
        auVar35._12_4_ = fVar145 * fVar145 * fVar145 * auVar83._12_4_ * -0.5;
        auVar35._16_4_ = fVar80 * fVar80 * fVar80 * -0.0;
        auVar35._20_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar35._24_4_ = fVar126 * fVar126 * fVar126 * -0.0;
        auVar35._28_4_ = 0;
        auVar89 = vfmadd231ps_avx512vl(auVar35,auVar89,auVar91);
        auVar36._4_4_ = auVar107._4_4_ * auVar89._4_4_;
        auVar36._0_4_ = auVar107._0_4_ * auVar89._0_4_;
        auVar36._8_4_ = auVar107._8_4_ * auVar89._8_4_;
        auVar36._12_4_ = auVar107._12_4_ * auVar89._12_4_;
        auVar36._16_4_ = auVar107._16_4_ * auVar89._16_4_;
        auVar36._20_4_ = auVar107._20_4_ * auVar89._20_4_;
        auVar36._24_4_ = auVar107._24_4_ * auVar89._24_4_;
        auVar36._28_4_ = auVar91._28_4_;
        auVar37._4_4_ = -auVar106._4_4_ * auVar89._4_4_;
        auVar37._0_4_ = -auVar106._0_4_ * auVar89._0_4_;
        auVar37._8_4_ = -auVar106._8_4_ * auVar89._8_4_;
        auVar37._12_4_ = -auVar106._12_4_ * auVar89._12_4_;
        auVar37._16_4_ = -fVar163 * auVar89._16_4_;
        auVar37._20_4_ = -fVar159 * auVar89._20_4_;
        auVar37._24_4_ = -fVar162 * auVar89._24_4_;
        auVar37._28_4_ = auVar90._28_4_;
        auVar89 = vmulps_avx512vl(auVar89,auVar99);
        auVar83 = vfmadd213ps_fma(auVar33,auVar100,auVar96);
        auVar82 = vfmadd213ps_fma(auVar34,auVar100,auVar97);
        auVar90 = vfmadd213ps_avx512vl(auVar92,auVar100,auVar95);
        auVar91 = vfmadd213ps_avx512vl(auVar36,ZEXT1632(auVar186),auVar88);
        auVar11 = vfnmadd213ps_fma(auVar33,auVar100,auVar96);
        auVar103 = ZEXT1632(auVar186);
        auVar81 = vfmadd213ps_fma(auVar37,auVar103,auVar98);
        auVar84 = vfnmadd213ps_fma(auVar34,auVar100,auVar97);
        auVar8 = vfmadd213ps_fma(auVar89,auVar103,auVar93);
        auVar94 = vfnmadd231ps_avx512vl(auVar95,auVar100,auVar92);
        auVar22 = vfnmadd213ps_fma(auVar36,auVar103,auVar88);
        auVar23 = vfnmadd213ps_fma(auVar37,auVar103,auVar98);
        auVar142 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar186),auVar89);
        auVar89 = vsubps_avx512vl(auVar91,ZEXT1632(auVar11));
        auVar92 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar84));
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar8),auVar94);
        auVar95 = vmulps_avx512vl(auVar92,auVar94);
        auVar9 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar84),auVar93);
        auVar38._4_4_ = auVar11._4_4_ * auVar93._4_4_;
        auVar38._0_4_ = auVar11._0_4_ * auVar93._0_4_;
        auVar38._8_4_ = auVar11._8_4_ * auVar93._8_4_;
        auVar38._12_4_ = auVar11._12_4_ * auVar93._12_4_;
        auVar38._16_4_ = auVar93._16_4_ * 0.0;
        auVar38._20_4_ = auVar93._20_4_ * 0.0;
        auVar38._24_4_ = auVar93._24_4_ * 0.0;
        auVar38._28_4_ = auVar93._28_4_;
        auVar93 = vfmsub231ps_avx512vl(auVar38,auVar94,auVar89);
        auVar39._4_4_ = auVar84._4_4_ * auVar89._4_4_;
        auVar39._0_4_ = auVar84._0_4_ * auVar89._0_4_;
        auVar39._8_4_ = auVar84._8_4_ * auVar89._8_4_;
        auVar39._12_4_ = auVar84._12_4_ * auVar89._12_4_;
        auVar39._16_4_ = auVar89._16_4_ * 0.0;
        auVar39._20_4_ = auVar89._20_4_ * 0.0;
        auVar39._24_4_ = auVar89._24_4_ * 0.0;
        auVar39._28_4_ = auVar89._28_4_;
        auVar10 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar11),auVar92);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar99,auVar93);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,ZEXT1632(auVar9));
        auVar99 = ZEXT1632(auVar85);
        uVar79 = vcmpps_avx512vl(auVar92,auVar99,2);
        bVar72 = (byte)uVar79;
        fVar145 = (float)((uint)(bVar72 & 1) * auVar83._0_4_ |
                         (uint)!(bool)(bVar72 & 1) * auVar22._0_4_);
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        fVar125 = (float)((uint)bVar74 * auVar83._4_4_ | (uint)!bVar74 * auVar22._4_4_);
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        fVar127 = (float)((uint)bVar74 * auVar83._8_4_ | (uint)!bVar74 * auVar22._8_4_);
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        fVar129 = (float)((uint)bVar74 * auVar83._12_4_ | (uint)!bVar74 * auVar22._12_4_);
        auVar95 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar145))));
        fVar80 = (float)((uint)(bVar72 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar23._0_4_);
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        fVar126 = (float)((uint)bVar74 * auVar82._4_4_ | (uint)!bVar74 * auVar23._4_4_);
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        fVar128 = (float)((uint)bVar74 * auVar82._8_4_ | (uint)!bVar74 * auVar23._8_4_);
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        fVar130 = (float)((uint)bVar74 * auVar82._12_4_ | (uint)!bVar74 * auVar23._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar80))));
        auVar108._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar142._0_4_
                    );
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar74 * auVar90._4_4_ | (uint)!bVar74 * auVar142._4_4_);
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar74 * auVar90._8_4_ | (uint)!bVar74 * auVar142._8_4_);
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar74 * auVar90._12_4_ | (uint)!bVar74 * auVar142._12_4_);
        fVar146 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar90._16_4_);
        auVar108._16_4_ = fVar146;
        fVar139 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar90._20_4_);
        auVar108._20_4_ = fVar139;
        fVar160 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar90._24_4_);
        auVar108._24_4_ = fVar160;
        iVar1 = (uint)(byte)(uVar79 >> 7) * auVar90._28_4_;
        auVar108._28_4_ = iVar1;
        auVar89 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar91);
        auVar109._0_4_ =
             (uint)(bVar72 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar9._0_4_;
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar74 * auVar89._4_4_ | (uint)!bVar74 * auVar9._4_4_;
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar74 * auVar89._8_4_ | (uint)!bVar74 * auVar9._8_4_;
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar74 * auVar89._12_4_ | (uint)!bVar74 * auVar9._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar89._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar89._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar89._24_4_;
        auVar109._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar89._28_4_;
        auVar89 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar81));
        auVar110._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar82._0_4_)
        ;
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar74 * auVar89._4_4_ | (uint)!bVar74 * auVar82._4_4_);
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar74 * auVar89._8_4_ | (uint)!bVar74 * auVar82._8_4_);
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar74 * auVar89._12_4_ | (uint)!bVar74 * auVar82._12_4_);
        fVar163 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar89._16_4_);
        auVar110._16_4_ = fVar163;
        fVar159 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar89._20_4_);
        auVar110._20_4_ = fVar159;
        fVar162 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar89._24_4_);
        auVar110._24_4_ = fVar162;
        auVar110._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar89._28_4_;
        auVar89 = vblendmps_avx512vl(auVar94,ZEXT1632(auVar8));
        auVar111._0_4_ =
             (float)((uint)(bVar72 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar90._0_4_)
        ;
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar74 * auVar89._4_4_ | (uint)!bVar74 * auVar90._4_4_);
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar74 * auVar89._8_4_ | (uint)!bVar74 * auVar90._8_4_);
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar74 * auVar89._12_4_ | (uint)!bVar74 * auVar90._12_4_);
        bVar74 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar74 * auVar89._16_4_ | (uint)!bVar74 * auVar90._16_4_);
        bVar74 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar74 * auVar89._20_4_ | (uint)!bVar74 * auVar90._20_4_);
        bVar74 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar74 * auVar89._24_4_ | (uint)!bVar74 * auVar90._24_4_);
        bVar74 = SUB81(uVar79 >> 7,0);
        auVar111._28_4_ = (uint)bVar74 * auVar89._28_4_ | (uint)!bVar74 * auVar90._28_4_;
        auVar112._0_4_ =
             (uint)(bVar72 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar91._0_4_;
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar74 * (int)auVar11._4_4_ | (uint)!bVar74 * auVar91._4_4_;
        bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar74 * (int)auVar11._8_4_ | (uint)!bVar74 * auVar91._8_4_;
        bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar74 * (int)auVar11._12_4_ | (uint)!bVar74 * auVar91._12_4_;
        auVar112._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar91._16_4_;
        auVar112._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar91._20_4_;
        auVar112._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar91._24_4_;
        auVar112._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar91._28_4_;
        bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar113._0_4_ =
             (uint)(bVar72 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar8._0_4_;
        bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar8._4_4_;
        bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar8._8_4_;
        bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar8._12_4_;
        auVar113._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar94._16_4_;
        auVar113._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar94._20_4_;
        auVar113._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar94._24_4_;
        iVar2 = (uint)(byte)(uVar79 >> 7) * auVar94._28_4_;
        auVar113._28_4_ = iVar2;
        auVar96 = vsubps_avx512vl(auVar112,auVar95);
        auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar84._12_4_ |
                                                (uint)!bVar19 * auVar81._12_4_,
                                                CONCAT48((uint)bVar17 * (int)auVar84._8_4_ |
                                                         (uint)!bVar17 * auVar81._8_4_,
                                                         CONCAT44((uint)bVar74 * (int)auVar84._4_4_
                                                                  | (uint)!bVar74 * auVar81._4_4_,
                                                                  (uint)(bVar72 & 1) *
                                                                  (int)auVar84._0_4_ |
                                                                  (uint)!(bool)(bVar72 & 1) *
                                                                  auVar81._0_4_)))),auVar103);
        auVar90 = vsubps_avx(auVar113,auVar108);
        auVar91 = vsubps_avx(auVar95,auVar109);
        auVar94 = vsubps_avx(auVar103,auVar110);
        auVar93 = vsubps_avx(auVar108,auVar111);
        auVar40._4_4_ = auVar90._4_4_ * fVar125;
        auVar40._0_4_ = auVar90._0_4_ * fVar145;
        auVar40._8_4_ = auVar90._8_4_ * fVar127;
        auVar40._12_4_ = auVar90._12_4_ * fVar129;
        auVar40._16_4_ = auVar90._16_4_ * 0.0;
        auVar40._20_4_ = auVar90._20_4_ * 0.0;
        auVar40._24_4_ = auVar90._24_4_ * 0.0;
        auVar40._28_4_ = iVar2;
        auVar83 = vfmsub231ps_fma(auVar40,auVar108,auVar96);
        auVar41._4_4_ = fVar126 * auVar96._4_4_;
        auVar41._0_4_ = fVar80 * auVar96._0_4_;
        auVar41._8_4_ = fVar128 * auVar96._8_4_;
        auVar41._12_4_ = fVar130 * auVar96._12_4_;
        auVar41._16_4_ = auVar96._16_4_ * 0.0;
        auVar41._20_4_ = auVar96._20_4_ * 0.0;
        auVar41._24_4_ = auVar96._24_4_ * 0.0;
        auVar41._28_4_ = auVar92._28_4_;
        auVar82 = vfmsub231ps_fma(auVar41,auVar95,auVar89);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar99,ZEXT1632(auVar83));
        auVar153._0_4_ = auVar89._0_4_ * auVar108._0_4_;
        auVar153._4_4_ = auVar89._4_4_ * auVar108._4_4_;
        auVar153._8_4_ = auVar89._8_4_ * auVar108._8_4_;
        auVar153._12_4_ = auVar89._12_4_ * auVar108._12_4_;
        auVar153._16_4_ = auVar89._16_4_ * fVar146;
        auVar153._20_4_ = auVar89._20_4_ * fVar139;
        auVar153._24_4_ = auVar89._24_4_ * fVar160;
        auVar153._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar153,auVar103,auVar90);
        auVar97 = vfmadd231ps_avx512vl(auVar92,auVar99,ZEXT1632(auVar83));
        auVar92 = vmulps_avx512vl(auVar93,auVar109);
        auVar92 = vfmsub231ps_avx512vl(auVar92,auVar91,auVar111);
        auVar42._4_4_ = auVar94._4_4_ * auVar111._4_4_;
        auVar42._0_4_ = auVar94._0_4_ * auVar111._0_4_;
        auVar42._8_4_ = auVar94._8_4_ * auVar111._8_4_;
        auVar42._12_4_ = auVar94._12_4_ * auVar111._12_4_;
        auVar42._16_4_ = auVar94._16_4_ * auVar111._16_4_;
        auVar42._20_4_ = auVar94._20_4_ * auVar111._20_4_;
        auVar42._24_4_ = auVar94._24_4_ * auVar111._24_4_;
        auVar42._28_4_ = auVar111._28_4_;
        auVar83 = vfmsub231ps_fma(auVar42,auVar110,auVar93);
        auVar154._0_4_ = auVar110._0_4_ * auVar91._0_4_;
        auVar154._4_4_ = auVar110._4_4_ * auVar91._4_4_;
        auVar154._8_4_ = auVar110._8_4_ * auVar91._8_4_;
        auVar154._12_4_ = auVar110._12_4_ * auVar91._12_4_;
        auVar154._16_4_ = fVar163 * auVar91._16_4_;
        auVar154._20_4_ = fVar159 * auVar91._20_4_;
        auVar154._24_4_ = fVar162 * auVar91._24_4_;
        auVar154._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar154,auVar94,auVar109);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar99,auVar92);
        auVar88 = vfmadd231ps_avx512vl(auVar92,auVar99,ZEXT1632(auVar83));
        auVar92 = vmaxps_avx(auVar97,auVar88);
        uVar134 = vcmpps_avx512vl(auVar92,auVar99,2);
        bVar78 = bVar78 & (byte)uVar134;
        auVar183 = ZEXT3264(local_3c0);
        auVar184 = ZEXT3264(local_3e0);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar190 = ZEXT3264(auVar98);
        auVar185 = ZEXT3264(local_440);
        if (bVar78 == 0) {
          bVar74 = false;
          auVar188 = ZEXT3264(local_4c0);
          auVar191 = ZEXT3264(local_4e0);
          auVar189 = ZEXT3264(local_500);
        }
        else {
          uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar176._4_4_ = uVar133;
          auVar176._0_4_ = uVar133;
          auVar176._8_4_ = uVar133;
          auVar176._12_4_ = uVar133;
          auVar176._16_4_ = uVar133;
          auVar176._20_4_ = uVar133;
          auVar176._24_4_ = uVar133;
          auVar176._28_4_ = uVar133;
          auVar178 = ZEXT3264(auVar176);
          auVar43._4_4_ = auVar93._4_4_ * auVar89._4_4_;
          auVar43._0_4_ = auVar93._0_4_ * auVar89._0_4_;
          auVar43._8_4_ = auVar93._8_4_ * auVar89._8_4_;
          auVar43._12_4_ = auVar93._12_4_ * auVar89._12_4_;
          auVar43._16_4_ = auVar93._16_4_ * auVar89._16_4_;
          auVar43._20_4_ = auVar93._20_4_ * auVar89._20_4_;
          auVar43._24_4_ = auVar93._24_4_ * auVar89._24_4_;
          auVar43._28_4_ = auVar92._28_4_;
          auVar81 = vfmsub231ps_fma(auVar43,auVar94,auVar90);
          auVar44._4_4_ = auVar90._4_4_ * auVar91._4_4_;
          auVar44._0_4_ = auVar90._0_4_ * auVar91._0_4_;
          auVar44._8_4_ = auVar90._8_4_ * auVar91._8_4_;
          auVar44._12_4_ = auVar90._12_4_ * auVar91._12_4_;
          auVar44._16_4_ = auVar90._16_4_ * auVar91._16_4_;
          auVar44._20_4_ = auVar90._20_4_ * auVar91._20_4_;
          auVar44._24_4_ = auVar90._24_4_ * auVar91._24_4_;
          auVar44._28_4_ = auVar90._28_4_;
          auVar82 = vfmsub231ps_fma(auVar44,auVar96,auVar93);
          auVar45._4_4_ = auVar94._4_4_ * auVar96._4_4_;
          auVar45._0_4_ = auVar94._0_4_ * auVar96._0_4_;
          auVar45._8_4_ = auVar94._8_4_ * auVar96._8_4_;
          auVar45._12_4_ = auVar94._12_4_ * auVar96._12_4_;
          auVar45._16_4_ = auVar94._16_4_ * auVar96._16_4_;
          auVar45._20_4_ = auVar94._20_4_ * auVar96._20_4_;
          auVar45._24_4_ = auVar94._24_4_ * auVar96._24_4_;
          auVar45._28_4_ = auVar94._28_4_;
          auVar8 = vfmsub231ps_fma(auVar45,auVar91,auVar89);
          auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar8));
          auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar81),auVar99);
          auVar89 = vrcp14ps_avx512vl(auVar92);
          auVar90 = vfnmadd213ps_avx512vl(auVar89,auVar92,auVar98);
          auVar83 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
          auVar46._4_4_ = auVar8._4_4_ * auVar108._4_4_;
          auVar46._0_4_ = auVar8._0_4_ * auVar108._0_4_;
          auVar46._8_4_ = auVar8._8_4_ * auVar108._8_4_;
          auVar46._12_4_ = auVar8._12_4_ * auVar108._12_4_;
          auVar46._16_4_ = fVar146 * 0.0;
          auVar46._20_4_ = fVar139 * 0.0;
          auVar46._24_4_ = fVar160 * 0.0;
          auVar46._28_4_ = iVar1;
          auVar82 = vfmadd231ps_fma(auVar46,auVar103,ZEXT1632(auVar82));
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar95,ZEXT1632(auVar81));
          fVar146 = auVar83._0_4_;
          fVar139 = auVar83._4_4_;
          fVar160 = auVar83._8_4_;
          fVar163 = auVar83._12_4_;
          local_260 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar163,
                                         CONCAT48(auVar82._8_4_ * fVar160,
                                                  CONCAT44(auVar82._4_4_ * fVar139,
                                                           auVar82._0_4_ * fVar146))));
          auVar166._4_4_ = fVar140;
          auVar166._0_4_ = fVar140;
          auVar166._8_4_ = fVar140;
          auVar166._12_4_ = fVar140;
          auVar166._16_4_ = fVar140;
          auVar166._20_4_ = fVar140;
          auVar166._24_4_ = fVar140;
          auVar166._28_4_ = fVar140;
          uVar134 = vcmpps_avx512vl(local_260,auVar176,2);
          uVar24 = vcmpps_avx512vl(auVar166,local_260,2);
          bVar78 = (byte)uVar134 & (byte)uVar24 & bVar78;
          auVar188 = ZEXT3264(local_4c0);
          auVar191 = ZEXT3264(local_4e0);
          auVar189 = ZEXT3264(local_500);
          if (bVar78 == 0) {
            bVar74 = false;
          }
          else {
            uVar134 = vcmpps_avx512vl(auVar92,auVar99,4);
            bVar78 = bVar78 & (byte)uVar134;
            auVar167 = ZEXT1664(local_600);
            if (bVar78 != 0) {
              fVar159 = auVar97._0_4_ * fVar146;
              fVar162 = auVar97._4_4_ * fVar139;
              auVar47._4_4_ = fVar162;
              auVar47._0_4_ = fVar159;
              fVar145 = auVar97._8_4_ * fVar160;
              auVar47._8_4_ = fVar145;
              fVar80 = auVar97._12_4_ * fVar163;
              auVar47._12_4_ = fVar80;
              fVar125 = auVar97._16_4_ * 0.0;
              auVar47._16_4_ = fVar125;
              fVar126 = auVar97._20_4_ * 0.0;
              auVar47._20_4_ = fVar126;
              fVar127 = auVar97._24_4_ * 0.0;
              auVar47._24_4_ = fVar127;
              auVar47._28_4_ = auVar92._28_4_;
              auVar89 = vsubps_avx512vl(auVar98,auVar47);
              local_2a0._0_4_ =
                   (float)((uint)(bVar72 & 1) * (int)fVar159 |
                          (uint)!(bool)(bVar72 & 1) * auVar89._0_4_);
              bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
              local_2a0._4_4_ = (float)((uint)bVar74 * (int)fVar162 | (uint)!bVar74 * auVar89._4_4_)
              ;
              bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
              local_2a0._8_4_ = (float)((uint)bVar74 * (int)fVar145 | (uint)!bVar74 * auVar89._8_4_)
              ;
              bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
              local_2a0._12_4_ =
                   (float)((uint)bVar74 * (int)fVar80 | (uint)!bVar74 * auVar89._12_4_);
              bVar74 = (bool)((byte)(uVar79 >> 4) & 1);
              local_2a0._16_4_ =
                   (float)((uint)bVar74 * (int)fVar125 | (uint)!bVar74 * auVar89._16_4_);
              bVar74 = (bool)((byte)(uVar79 >> 5) & 1);
              local_2a0._20_4_ =
                   (float)((uint)bVar74 * (int)fVar126 | (uint)!bVar74 * auVar89._20_4_);
              bVar74 = (bool)((byte)(uVar79 >> 6) & 1);
              local_2a0._24_4_ =
                   (float)((uint)bVar74 * (int)fVar127 | (uint)!bVar74 * auVar89._24_4_);
              bVar74 = SUB81(uVar79 >> 7,0);
              local_2a0._28_4_ =
                   (float)((uint)bVar74 * auVar92._28_4_ | (uint)!bVar74 * auVar89._28_4_);
              auVar92 = vsubps_avx(ZEXT1632(auVar186),auVar100);
              auVar83 = vfmadd213ps_fma(auVar92,local_2a0,auVar100);
              uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar27._4_4_ = uVar133;
              auVar27._0_4_ = uVar133;
              auVar27._8_4_ = uVar133;
              auVar27._12_4_ = uVar133;
              auVar27._16_4_ = uVar133;
              auVar27._20_4_ = uVar133;
              auVar27._24_4_ = uVar133;
              auVar27._28_4_ = uVar133;
              auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                           CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                    CONCAT44(auVar83._4_4_ +
                                                                             auVar83._4_4_,
                                                                             auVar83._0_4_ +
                                                                             auVar83._0_4_)))),
                                        auVar27);
              uVar134 = vcmpps_avx512vl(local_260,auVar92,6);
              if (((byte)uVar134 & bVar78) != 0) {
                auVar144._0_4_ = auVar88._0_4_ * fVar146;
                auVar144._4_4_ = auVar88._4_4_ * fVar139;
                auVar144._8_4_ = auVar88._8_4_ * fVar160;
                auVar144._12_4_ = auVar88._12_4_ * fVar163;
                auVar144._16_4_ = auVar88._16_4_ * 0.0;
                auVar144._20_4_ = auVar88._20_4_ * 0.0;
                auVar144._24_4_ = auVar88._24_4_ * 0.0;
                auVar144._28_4_ = 0;
                auVar92 = vsubps_avx512vl(auVar98,auVar144);
                auVar114._0_4_ =
                     (uint)(bVar72 & 1) * (int)auVar144._0_4_ |
                     (uint)!(bool)(bVar72 & 1) * auVar92._0_4_;
                bVar74 = (bool)((byte)(uVar79 >> 1) & 1);
                auVar114._4_4_ = (uint)bVar74 * (int)auVar144._4_4_ | (uint)!bVar74 * auVar92._4_4_;
                bVar74 = (bool)((byte)(uVar79 >> 2) & 1);
                auVar114._8_4_ = (uint)bVar74 * (int)auVar144._8_4_ | (uint)!bVar74 * auVar92._8_4_;
                bVar74 = (bool)((byte)(uVar79 >> 3) & 1);
                auVar114._12_4_ =
                     (uint)bVar74 * (int)auVar144._12_4_ | (uint)!bVar74 * auVar92._12_4_;
                bVar74 = (bool)((byte)(uVar79 >> 4) & 1);
                auVar114._16_4_ =
                     (uint)bVar74 * (int)auVar144._16_4_ | (uint)!bVar74 * auVar92._16_4_;
                bVar74 = (bool)((byte)(uVar79 >> 5) & 1);
                auVar114._20_4_ =
                     (uint)bVar74 * (int)auVar144._20_4_ | (uint)!bVar74 * auVar92._20_4_;
                bVar74 = (bool)((byte)(uVar79 >> 6) & 1);
                auVar114._24_4_ =
                     (uint)bVar74 * (int)auVar144._24_4_ | (uint)!bVar74 * auVar92._24_4_;
                auVar114._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar92._28_4_;
                auVar28._8_4_ = 0x40000000;
                auVar28._0_8_ = 0x4000000040000000;
                auVar28._12_4_ = 0x40000000;
                auVar28._16_4_ = 0x40000000;
                auVar28._20_4_ = 0x40000000;
                auVar28._24_4_ = 0x40000000;
                auVar28._28_4_ = 0x40000000;
                local_280 = vfmsub132ps_avx512vl(auVar114,auVar98,auVar28);
                local_240 = 0;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar74 = true, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar146 = 1.0 / (float)local_550._0_4_;
                    local_1e0[0] = fVar146 * (local_2a0._0_4_ + 0.0);
                    local_1e0[1] = fVar146 * (local_2a0._4_4_ + 1.0);
                    local_1e0[2] = fVar146 * (local_2a0._8_4_ + 2.0);
                    local_1e0[3] = fVar146 * (local_2a0._12_4_ + 3.0);
                    fStack_1d0 = fVar146 * (local_2a0._16_4_ + 4.0);
                    fStack_1cc = fVar146 * (local_2a0._20_4_ + 5.0);
                    fStack_1c8 = fVar146 * (local_2a0._24_4_ + 6.0);
                    fStack_1c4 = local_2a0._28_4_ + 7.0;
                    local_1c0 = local_280;
                    local_1a0 = local_260;
                    local_2c0 = 0;
                    uVar73 = (ulong)((byte)uVar134 & bVar78);
                    for (uVar79 = uVar73; (uVar79 & 1) == 0;
                        uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                      local_2c0 = local_2c0 + 1;
                    }
                    local_5c0 = vpbroadcastd_avx512vl();
                    local_5d0 = vpbroadcastd_avx512vl();
                    local_460 = fVar140;
                    local_420 = auVar176;
                    local_23c = iVar13;
                    local_230 = local_600;
                    local_220 = local_5e0;
                    uStack_218 = uStack_5d8;
                    local_210 = local_5f0;
                    uStack_208 = uStack_5e8;
                    do {
                      auVar186 = auVar187._0_16_;
                      local_380 = (undefined4)uVar73;
                      uStack_37c = (undefined4)(uVar73 >> 0x20);
                      local_320 = local_1e0[local_2c0];
                      local_310 = *(undefined4 *)(local_1c0 + local_2c0 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_1a0 + local_2c0 * 4);
                      local_5b0.context = context->user;
                      fVar139 = 1.0 - local_320;
                      fVar146 = fVar139 * fVar139 * -3.0;
                      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),
                                                ZEXT416((uint)(local_320 * fVar139)),
                                                ZEXT416(0xc0000000));
                      auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar139)),
                                                ZEXT416((uint)(local_320 * local_320)),
                                                ZEXT416(0x40000000));
                      fVar139 = auVar83._0_4_ * 3.0;
                      fVar160 = auVar82._0_4_ * 3.0;
                      fVar163 = local_320 * local_320 * 3.0;
                      auVar157._0_4_ = fVar163 * local_530;
                      auVar157._4_4_ = fVar163 * fStack_52c;
                      auVar157._8_4_ = fVar163 * fStack_528;
                      auVar157._12_4_ = fVar163 * fStack_524;
                      auVar135._4_4_ = fVar160;
                      auVar135._0_4_ = fVar160;
                      auVar135._8_4_ = fVar160;
                      auVar135._12_4_ = fVar160;
                      auVar66._8_8_ = uStack_5e8;
                      auVar66._0_8_ = local_5f0;
                      auVar83 = vfmadd132ps_fma(auVar135,auVar157,auVar66);
                      auVar148._4_4_ = fVar139;
                      auVar148._0_4_ = fVar139;
                      auVar148._8_4_ = fVar139;
                      auVar148._12_4_ = fVar139;
                      auVar68._8_8_ = uStack_5d8;
                      auVar68._0_8_ = local_5e0;
                      auVar83 = vfmadd132ps_fma(auVar148,auVar83,auVar68);
                      auVar136._4_4_ = fVar146;
                      auVar136._0_4_ = fVar146;
                      auVar136._8_4_ = fVar146;
                      auVar136._12_4_ = fVar146;
                      auVar83 = vfmadd213ps_fma(auVar136,auVar167._0_16_,auVar83);
                      local_350 = auVar83._0_4_;
                      local_340 = vshufps_avx(auVar83,auVar83,0x55);
                      local_330 = vshufps_avx(auVar83,auVar83,0xaa);
                      local_300 = local_5d0._0_8_;
                      uStack_2f8 = local_5d0._8_8_;
                      local_2f0 = local_5c0;
                      vpcmpeqd_avx2(ZEXT1632(local_5c0),ZEXT1632(local_5c0));
                      uStack_2dc = (local_5b0.context)->instID[0];
                      local_2e0 = uStack_2dc;
                      uStack_2d8 = uStack_2dc;
                      uStack_2d4 = uStack_2dc;
                      uStack_2d0 = (local_5b0.context)->instPrimID[0];
                      uStack_2cc = uStack_2d0;
                      uStack_2c8 = uStack_2d0;
                      uStack_2c4 = uStack_2d0;
                      local_620 = local_390;
                      local_5b0.valid = (int *)local_620;
                      local_5b0.geometryUserPtr = pGVar14->userPtr;
                      local_5b0.hit = (RTCHitN *)&local_350;
                      local_5b0.N = 4;
                      local_5b0.ray = (RTCRayN *)ray;
                      uStack_34c = local_350;
                      uStack_348 = local_350;
                      uStack_344 = local_350;
                      fStack_31c = local_320;
                      fStack_318 = local_320;
                      fStack_314 = local_320;
                      uStack_30c = local_310;
                      uStack_308 = local_310;
                      uStack_304 = local_310;
                      if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar14->occlusionFilterN)(&local_5b0);
                        auVar178 = ZEXT3264(local_420);
                        auVar189 = ZEXT3264(local_500);
                        auVar191 = ZEXT3264(local_4e0);
                        auVar188 = ZEXT3264(local_4c0);
                        auVar182 = ZEXT3264(local_580);
                        auVar192 = ZEXT3264(local_400);
                        auVar185 = ZEXT3264(local_440);
                        auVar184 = ZEXT3264(local_3e0);
                        auVar183 = ZEXT3264(local_3c0);
                        auVar167 = ZEXT1664(local_600);
                        auVar83 = vxorps_avx512vl(auVar186,auVar186);
                        auVar187 = ZEXT1664(auVar83);
                        fVar140 = local_460;
                        fVar132 = (float)local_520._0_4_;
                      }
                      auVar83 = auVar187._0_16_;
                      uVar79 = vptestmd_avx512vl(local_620,local_620);
                      if ((uVar79 & 0xf) == 0) {
                        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar190 = ZEXT3264(auVar92);
                        uVar73 = CONCAT44(uStack_37c,local_380);
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if (p_Var15 == (RTCFilterFunctionN)0x0) {
                          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar190 = ZEXT3264(auVar92);
                        }
                        else {
                          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar190 = ZEXT3264(auVar92);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var15)(&local_5b0);
                            auVar178 = ZEXT3264(local_420);
                            auVar189 = ZEXT3264(local_500);
                            auVar191 = ZEXT3264(local_4e0);
                            auVar188 = ZEXT3264(local_4c0);
                            auVar182 = ZEXT3264(local_580);
                            auVar192 = ZEXT3264(local_400);
                            auVar185 = ZEXT3264(local_440);
                            auVar184 = ZEXT3264(local_3e0);
                            auVar183 = ZEXT3264(local_3c0);
                            auVar167 = ZEXT1664(local_600);
                            auVar83 = vxorps_avx512vl(auVar83,auVar83);
                            auVar187 = ZEXT1664(auVar83);
                            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar190 = ZEXT3264(auVar92);
                            fVar140 = local_460;
                            fVar132 = (float)local_520._0_4_;
                          }
                        }
                        uVar79 = vptestmd_avx512vl(local_620,local_620);
                        uVar79 = uVar79 & 0xf;
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar74 = (bool)((byte)uVar79 & 1);
                        bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar79 >> 2) & 1);
                        bVar19 = SUB81(uVar79 >> 3,0);
                        *(uint *)(local_5b0.ray + 0x80) =
                             (uint)bVar74 * auVar83._0_4_ |
                             (uint)!bVar74 * *(int *)(local_5b0.ray + 0x80);
                        *(uint *)(local_5b0.ray + 0x84) =
                             (uint)bVar16 * auVar83._4_4_ |
                             (uint)!bVar16 * *(int *)(local_5b0.ray + 0x84);
                        *(uint *)(local_5b0.ray + 0x88) =
                             (uint)bVar17 * auVar83._8_4_ |
                             (uint)!bVar17 * *(int *)(local_5b0.ray + 0x88);
                        *(uint *)(local_5b0.ray + 0x8c) =
                             (uint)bVar19 * auVar83._12_4_ |
                             (uint)!bVar19 * *(int *)(local_5b0.ray + 0x8c);
                        uVar73 = CONCAT44(uStack_37c,local_380);
                        if ((byte)uVar79 != 0) {
                          bVar74 = true;
                          break;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x80) = auVar178._0_4_;
                      uVar79 = local_2c0 & 0x3f;
                      bVar74 = false;
                      local_2c0 = 0;
                      uVar73 = uVar73 ^ 1L << uVar79;
                      for (uVar79 = uVar73; (uVar79 & 1) == 0;
                          uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                        local_2c0 = local_2c0 + 1;
                      }
                    } while (uVar73 != 0);
                  }
                  goto LAB_01d5c79d;
                }
              }
            }
            bVar74 = false;
          }
        }
      }
LAB_01d5c79d:
      if (8 < iVar13) {
        local_520 = vpbroadcastd_avx512vl();
        fStack_2b8 = 1.0 / (float)local_550._0_4_;
        local_550 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar75 = 8;
        local_460 = fVar132;
        fStack_45c = fVar132;
        fStack_458 = fVar132;
        fStack_454 = fVar132;
        fStack_450 = fVar132;
        fStack_44c = fVar132;
        fStack_448 = fVar132;
        fStack_444 = fVar132;
        local_380 = fVar140;
        uStack_37c = fVar140;
        uStack_378 = fVar140;
        uStack_374 = fVar140;
        uStack_370 = fVar140;
        uStack_36c = fVar140;
        uStack_368 = fVar140;
        uStack_364 = fVar140;
        fStack_2b4 = fStack_2b8;
        fStack_2b0 = fStack_2b8;
        fStack_2ac = fStack_2b8;
        fStack_2a8 = fStack_2b8;
        fStack_2a4 = fStack_2b8;
        local_2c0._0_4_ = fStack_2b8;
        local_2c0._4_4_ = fStack_2b8;
        do {
          auVar92 = vpbroadcastd_avx512vl();
          auVar94 = vpor_avx2(auVar92,_DAT_01fe9900);
          uVar24 = vpcmpd_avx512vl(auVar94,local_520,1);
          auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 * 4 + lVar25);
          auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21aa768 + lVar75 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21aabec + lVar75 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21ab070 + lVar75 * 4);
          local_4e0 = auVar191._0_32_;
          auVar93 = vmulps_avx512vl(local_4e0,auVar91);
          local_500 = auVar189._0_32_;
          auVar95 = vmulps_avx512vl(local_500,auVar91);
          auVar48._4_4_ = auVar91._4_4_ * (float)local_100._4_4_;
          auVar48._0_4_ = auVar91._0_4_ * (float)local_100._0_4_;
          auVar48._8_4_ = auVar91._8_4_ * fStack_f8;
          auVar48._12_4_ = auVar91._12_4_ * fStack_f4;
          auVar48._16_4_ = auVar91._16_4_ * fStack_f0;
          auVar48._20_4_ = auVar91._20_4_ * fStack_ec;
          auVar48._24_4_ = auVar91._24_4_ * fStack_e8;
          auVar48._28_4_ = auVar94._28_4_;
          auVar102 = auVar182._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar102);
          local_4c0 = auVar188._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar95,auVar90,local_4c0);
          auVar95 = vfmadd231ps_avx512vl(auVar48,auVar90,local_e0);
          auVar143 = auVar185._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar143);
          local_400 = auVar192._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_400);
          auVar83 = vfmadd231ps_fma(auVar95,auVar89,local_c0);
          local_3c0 = auVar183._0_32_;
          auVar88 = vfmadd231ps_avx512vl(auVar94,auVar92,local_3c0);
          local_3e0 = auVar184._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar93,auVar92,local_3e0);
          auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 * 4 + lVar25);
          auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21acb88 + lVar75 * 4);
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar92,local_a0);
          auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21ad00c + lVar75 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar25 + 0x21ad490 + lVar75 * 4);
          auVar96 = vmulps_avx512vl(local_4e0,auVar103);
          auVar97 = vmulps_avx512vl(local_500,auVar103);
          auVar49._4_4_ = auVar103._4_4_ * (float)local_100._4_4_;
          auVar49._0_4_ = auVar103._0_4_ * (float)local_100._0_4_;
          auVar49._8_4_ = auVar103._8_4_ * fStack_f8;
          auVar49._12_4_ = auVar103._12_4_ * fStack_f4;
          auVar49._16_4_ = auVar103._16_4_ * fStack_f0;
          auVar49._20_4_ = auVar103._20_4_ * fStack_ec;
          auVar49._24_4_ = auVar103._24_4_ * fStack_e8;
          auVar49._28_4_ = uStack_e4;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar102);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_4c0);
          auVar99 = vfmadd231ps_avx512vl(auVar49,auVar95,local_e0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar143);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_400);
          auVar82 = vfmadd231ps_fma(auVar99,auVar93,local_c0);
          auVar99 = vfmadd231ps_avx512vl(auVar96,auVar94,local_3c0);
          auVar86 = vfmadd231ps_avx512vl(auVar97,auVar94,local_3e0);
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar94,local_a0);
          auVar87 = vmaxps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar82));
          auVar96 = vsubps_avx(auVar99,auVar88);
          auVar97 = vsubps_avx(auVar86,auVar98);
          auVar100 = vmulps_avx512vl(auVar98,auVar96);
          auVar101 = vmulps_avx512vl(auVar88,auVar97);
          auVar100 = vsubps_avx512vl(auVar100,auVar101);
          auVar101 = vmulps_avx512vl(auVar97,auVar97);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar96);
          auVar87 = vmulps_avx512vl(auVar87,auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar101);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          uVar134 = vcmpps_avx512vl(auVar100,auVar87,2);
          bVar78 = (byte)uVar24 & (byte)uVar134;
          if (bVar78 == 0) {
            auVar192 = ZEXT3264(local_400);
            auVar182 = ZEXT3264(auVar102);
          }
          else {
            auVar103 = vmulps_avx512vl(local_4a0,auVar103);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_160,auVar103);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar95);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_120,auVar93);
            auVar91 = vmulps_avx512vl(local_4a0,auVar91);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_160,auVar91);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
            auVar93 = vfmadd213ps_avx512vl(auVar92,local_120,auVar89);
            auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21ab4f4 + lVar75 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21ab978 + lVar75 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21abdfc + lVar75 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21ac280 + lVar75 * 4);
            auVar95 = vmulps_avx512vl(local_4e0,auVar91);
            auVar103 = vmulps_avx512vl(local_500,auVar91);
            auVar91 = vmulps_avx512vl(local_4a0,auVar91);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar102);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar90,local_4c0);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_160,auVar90);
            auVar91 = vfmadd231ps_avx512vl(auVar95,auVar89,auVar143);
            auVar95 = vfmadd231ps_avx512vl(auVar103,auVar89,local_400);
            auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar92,local_3c0);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_3e0);
            auVar103 = vfmadd231ps_avx512vl(auVar89,local_120,auVar92);
            auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21ad914 + lVar75 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21ae21c + lVar75 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21ae6a0 + lVar75 * 4);
            auVar87 = vmulps_avx512vl(local_4e0,auVar90);
            auVar100 = vmulps_avx512vl(local_500,auVar90);
            auVar90 = vmulps_avx512vl(local_4a0,auVar90);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar102);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar89,local_4c0);
            auVar90 = vfmadd231ps_avx512vl(auVar90,local_160,auVar89);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21add98 + lVar75 * 4);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar143);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar89,local_400);
            auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
            auVar90 = vfmadd231ps_avx512vl(auVar87,auVar92,local_3c0);
            auVar87 = vfmadd231ps_avx512vl(auVar100,auVar92,local_3e0);
            auVar89 = vfmadd231ps_avx512vl(auVar89,local_120,auVar92);
            auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar91,auVar100);
            vandps_avx512vl(auVar95,auVar100);
            auVar92 = vmaxps_avx(auVar100,auVar100);
            vandps_avx512vl(auVar103,auVar100);
            auVar92 = vmaxps_avx(auVar92,auVar100);
            auVar70._4_4_ = fStack_45c;
            auVar70._0_4_ = local_460;
            auVar70._8_4_ = fStack_458;
            auVar70._12_4_ = fStack_454;
            auVar70._16_4_ = fStack_450;
            auVar70._20_4_ = fStack_44c;
            auVar70._24_4_ = fStack_448;
            auVar70._28_4_ = fStack_444;
            uVar79 = vcmpps_avx512vl(auVar92,auVar70,1);
            bVar16 = (bool)((byte)uVar79 & 1);
            auVar115._0_4_ = (float)((uint)bVar16 * auVar96._0_4_ | (uint)!bVar16 * auVar91._0_4_);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar91._4_4_);
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar91._8_4_);
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar91._12_4_);
            bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar115._16_4_ =
                 (float)((uint)bVar16 * auVar96._16_4_ | (uint)!bVar16 * auVar91._16_4_);
            bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar115._20_4_ =
                 (float)((uint)bVar16 * auVar96._20_4_ | (uint)!bVar16 * auVar91._20_4_);
            bVar16 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar115._24_4_ =
                 (float)((uint)bVar16 * auVar96._24_4_ | (uint)!bVar16 * auVar91._24_4_);
            bVar16 = SUB81(uVar79 >> 7,0);
            auVar115._28_4_ = (uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar91._28_4_;
            bVar16 = (bool)((byte)uVar79 & 1);
            auVar116._0_4_ = (float)((uint)bVar16 * auVar97._0_4_ | (uint)!bVar16 * auVar95._0_4_);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar95._4_4_);
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar95._8_4_);
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar95._12_4_);
            bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar16 * auVar97._16_4_ | (uint)!bVar16 * auVar95._16_4_);
            bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar16 * auVar97._20_4_ | (uint)!bVar16 * auVar95._20_4_);
            bVar16 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar16 * auVar97._24_4_ | (uint)!bVar16 * auVar95._24_4_);
            bVar16 = SUB81(uVar79 >> 7,0);
            auVar116._28_4_ = (uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar95._28_4_;
            vandps_avx512vl(auVar90,auVar100);
            vandps_avx512vl(auVar87,auVar100);
            auVar92 = vmaxps_avx(auVar116,auVar116);
            vandps_avx512vl(auVar89,auVar100);
            auVar92 = vmaxps_avx(auVar92,auVar116);
            uVar79 = vcmpps_avx512vl(auVar92,auVar70,1);
            bVar16 = (bool)((byte)uVar79 & 1);
            auVar117._0_4_ = (uint)bVar16 * auVar96._0_4_ | (uint)!bVar16 * auVar90._0_4_;
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar16 * auVar96._4_4_ | (uint)!bVar16 * auVar90._4_4_;
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar16 * auVar96._8_4_ | (uint)!bVar16 * auVar90._8_4_;
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar16 * auVar96._12_4_ | (uint)!bVar16 * auVar90._12_4_;
            bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar117._16_4_ = (uint)bVar16 * auVar96._16_4_ | (uint)!bVar16 * auVar90._16_4_;
            bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar117._20_4_ = (uint)bVar16 * auVar96._20_4_ | (uint)!bVar16 * auVar90._20_4_;
            bVar16 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar117._24_4_ = (uint)bVar16 * auVar96._24_4_ | (uint)!bVar16 * auVar90._24_4_;
            bVar16 = SUB81(uVar79 >> 7,0);
            auVar117._28_4_ = (uint)bVar16 * auVar96._28_4_ | (uint)!bVar16 * auVar90._28_4_;
            bVar16 = (bool)((byte)uVar79 & 1);
            auVar118._0_4_ = (float)((uint)bVar16 * auVar97._0_4_ | (uint)!bVar16 * auVar87._0_4_);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar87._4_4_);
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar87._8_4_);
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar87._12_4_);
            bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar16 * auVar97._16_4_ | (uint)!bVar16 * auVar87._16_4_);
            bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar16 * auVar97._20_4_ | (uint)!bVar16 * auVar87._20_4_);
            bVar16 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar16 * auVar97._24_4_ | (uint)!bVar16 * auVar87._24_4_);
            bVar16 = SUB81(uVar79 >> 7,0);
            auVar118._28_4_ = (uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar87._28_4_;
            auVar170._8_4_ = 0x80000000;
            auVar170._0_8_ = 0x8000000080000000;
            auVar170._12_4_ = 0x80000000;
            auVar170._16_4_ = 0x80000000;
            auVar170._20_4_ = 0x80000000;
            auVar170._24_4_ = 0x80000000;
            auVar170._28_4_ = 0x80000000;
            auVar92 = vxorps_avx512vl(auVar117,auVar170);
            auVar87 = auVar187._0_32_;
            auVar89 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar87);
            auVar186 = vfmadd231ps_fma(auVar89,auVar116,auVar116);
            auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar186));
            auVar181._8_4_ = 0xbf000000;
            auVar181._0_8_ = 0xbf000000bf000000;
            auVar181._12_4_ = 0xbf000000;
            auVar181._16_4_ = 0xbf000000;
            auVar181._20_4_ = 0xbf000000;
            auVar181._24_4_ = 0xbf000000;
            auVar181._28_4_ = 0xbf000000;
            fVar140 = auVar89._0_4_;
            fVar132 = auVar89._4_4_;
            fVar146 = auVar89._8_4_;
            fVar139 = auVar89._12_4_;
            fVar160 = auVar89._16_4_;
            fVar163 = auVar89._20_4_;
            fVar159 = auVar89._24_4_;
            auVar50._4_4_ = fVar132 * fVar132 * fVar132 * auVar186._4_4_ * -0.5;
            auVar50._0_4_ = fVar140 * fVar140 * fVar140 * auVar186._0_4_ * -0.5;
            auVar50._8_4_ = fVar146 * fVar146 * fVar146 * auVar186._8_4_ * -0.5;
            auVar50._12_4_ = fVar139 * fVar139 * fVar139 * auVar186._12_4_ * -0.5;
            auVar50._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
            auVar50._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
            auVar50._24_4_ = fVar159 * fVar159 * fVar159 * -0.0;
            auVar50._28_4_ = auVar116._28_4_;
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar89 = vfmadd231ps_avx512vl(auVar50,auVar90,auVar89);
            auVar51._4_4_ = auVar116._4_4_ * auVar89._4_4_;
            auVar51._0_4_ = auVar116._0_4_ * auVar89._0_4_;
            auVar51._8_4_ = auVar116._8_4_ * auVar89._8_4_;
            auVar51._12_4_ = auVar116._12_4_ * auVar89._12_4_;
            auVar51._16_4_ = auVar116._16_4_ * auVar89._16_4_;
            auVar51._20_4_ = auVar116._20_4_ * auVar89._20_4_;
            auVar51._24_4_ = auVar116._24_4_ * auVar89._24_4_;
            auVar51._28_4_ = 0;
            auVar52._4_4_ = auVar89._4_4_ * -auVar115._4_4_;
            auVar52._0_4_ = auVar89._0_4_ * -auVar115._0_4_;
            auVar52._8_4_ = auVar89._8_4_ * -auVar115._8_4_;
            auVar52._12_4_ = auVar89._12_4_ * -auVar115._12_4_;
            auVar52._16_4_ = auVar89._16_4_ * -auVar115._16_4_;
            auVar52._20_4_ = auVar89._20_4_ * -auVar115._20_4_;
            auVar52._24_4_ = auVar89._24_4_ * -auVar115._24_4_;
            auVar52._28_4_ = auVar116._28_4_;
            auVar91 = vmulps_avx512vl(auVar89,auVar87);
            auVar89 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar87);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar118,auVar118);
            auVar95 = vrsqrt14ps_avx512vl(auVar89);
            auVar89 = vmulps_avx512vl(auVar89,auVar181);
            fVar140 = auVar95._0_4_;
            fVar132 = auVar95._4_4_;
            fVar146 = auVar95._8_4_;
            fVar139 = auVar95._12_4_;
            fVar160 = auVar95._16_4_;
            fVar163 = auVar95._20_4_;
            fVar159 = auVar95._24_4_;
            auVar53._4_4_ = fVar132 * fVar132 * fVar132 * auVar89._4_4_;
            auVar53._0_4_ = fVar140 * fVar140 * fVar140 * auVar89._0_4_;
            auVar53._8_4_ = fVar146 * fVar146 * fVar146 * auVar89._8_4_;
            auVar53._12_4_ = fVar139 * fVar139 * fVar139 * auVar89._12_4_;
            auVar53._16_4_ = fVar160 * fVar160 * fVar160 * auVar89._16_4_;
            auVar53._20_4_ = fVar163 * fVar163 * fVar163 * auVar89._20_4_;
            auVar53._24_4_ = fVar159 * fVar159 * fVar159 * auVar89._24_4_;
            auVar53._28_4_ = auVar89._28_4_;
            auVar89 = vfmadd231ps_avx512vl(auVar53,auVar90,auVar95);
            auVar54._4_4_ = auVar118._4_4_ * auVar89._4_4_;
            auVar54._0_4_ = auVar118._0_4_ * auVar89._0_4_;
            auVar54._8_4_ = auVar118._8_4_ * auVar89._8_4_;
            auVar54._12_4_ = auVar118._12_4_ * auVar89._12_4_;
            auVar54._16_4_ = auVar118._16_4_ * auVar89._16_4_;
            auVar54._20_4_ = auVar118._20_4_ * auVar89._20_4_;
            auVar54._24_4_ = auVar118._24_4_ * auVar89._24_4_;
            auVar54._28_4_ = auVar95._28_4_;
            auVar55._4_4_ = auVar89._4_4_ * auVar92._4_4_;
            auVar55._0_4_ = auVar89._0_4_ * auVar92._0_4_;
            auVar55._8_4_ = auVar89._8_4_ * auVar92._8_4_;
            auVar55._12_4_ = auVar89._12_4_ * auVar92._12_4_;
            auVar55._16_4_ = auVar89._16_4_ * auVar92._16_4_;
            auVar55._20_4_ = auVar89._20_4_ * auVar92._20_4_;
            auVar55._24_4_ = auVar89._24_4_ * auVar92._24_4_;
            auVar55._28_4_ = auVar92._28_4_;
            auVar92 = vmulps_avx512vl(auVar89,auVar87);
            auVar186 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar83),auVar88);
            auVar89 = ZEXT1632(auVar83);
            auVar81 = vfmadd213ps_fma(auVar52,auVar89,auVar98);
            auVar90 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar93);
            auVar95 = vfmadd213ps_avx512vl(auVar54,ZEXT1632(auVar82),auVar99);
            auVar84 = vfnmadd213ps_fma(auVar51,auVar89,auVar88);
            auVar103 = ZEXT1632(auVar82);
            auVar8 = vfmadd213ps_fma(auVar55,auVar103,auVar86);
            auVar22 = vfnmadd213ps_fma(auVar52,auVar89,auVar98);
            auVar9 = vfmadd213ps_fma(auVar92,auVar103,auVar94);
            auVar98 = ZEXT1632(auVar83);
            auVar85 = vfnmadd231ps_fma(auVar93,auVar98,auVar91);
            auVar23 = vfnmadd213ps_fma(auVar54,auVar103,auVar99);
            auVar142 = vfnmadd213ps_fma(auVar55,auVar103,auVar86);
            auVar147 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar82),auVar92);
            auVar94 = vsubps_avx512vl(auVar95,ZEXT1632(auVar84));
            auVar92 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar22));
            auVar89 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar85));
            auVar56._4_4_ = auVar92._4_4_ * auVar85._4_4_;
            auVar56._0_4_ = auVar92._0_4_ * auVar85._0_4_;
            auVar56._8_4_ = auVar92._8_4_ * auVar85._8_4_;
            auVar56._12_4_ = auVar92._12_4_ * auVar85._12_4_;
            auVar56._16_4_ = auVar92._16_4_ * 0.0;
            auVar56._20_4_ = auVar92._20_4_ * 0.0;
            auVar56._24_4_ = auVar92._24_4_ * 0.0;
            auVar56._28_4_ = auVar91._28_4_;
            auVar83 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar22),auVar89);
            auVar57._4_4_ = auVar89._4_4_ * auVar84._4_4_;
            auVar57._0_4_ = auVar89._0_4_ * auVar84._0_4_;
            auVar57._8_4_ = auVar89._8_4_ * auVar84._8_4_;
            auVar57._12_4_ = auVar89._12_4_ * auVar84._12_4_;
            auVar57._16_4_ = auVar89._16_4_ * 0.0;
            auVar57._20_4_ = auVar89._20_4_ * 0.0;
            auVar57._24_4_ = auVar89._24_4_ * 0.0;
            auVar57._28_4_ = auVar89._28_4_;
            auVar10 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar85),auVar94);
            auVar58._4_4_ = auVar22._4_4_ * auVar94._4_4_;
            auVar58._0_4_ = auVar22._0_4_ * auVar94._0_4_;
            auVar58._8_4_ = auVar22._8_4_ * auVar94._8_4_;
            auVar58._12_4_ = auVar22._12_4_ * auVar94._12_4_;
            auVar58._16_4_ = auVar94._16_4_ * 0.0;
            auVar58._20_4_ = auVar94._20_4_ * 0.0;
            auVar58._24_4_ = auVar94._24_4_ * 0.0;
            auVar58._28_4_ = auVar94._28_4_;
            auVar11 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar84),auVar92);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar87,ZEXT1632(auVar10));
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar83));
            uVar79 = vcmpps_avx512vl(auVar92,auVar87,2);
            bVar72 = (byte)uVar79;
            fVar80 = (float)((uint)(bVar72 & 1) * auVar186._0_4_ |
                            (uint)!(bool)(bVar72 & 1) * auVar23._0_4_);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            fVar126 = (float)((uint)bVar16 * auVar186._4_4_ | (uint)!bVar16 * auVar23._4_4_);
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            fVar128 = (float)((uint)bVar16 * auVar186._8_4_ | (uint)!bVar16 * auVar23._8_4_);
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            fVar130 = (float)((uint)bVar16 * auVar186._12_4_ | (uint)!bVar16 * auVar23._12_4_);
            auVar103 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar80))));
            fVar125 = (float)((uint)(bVar72 & 1) * auVar81._0_4_ |
                             (uint)!(bool)(bVar72 & 1) * auVar142._0_4_);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            fVar127 = (float)((uint)bVar16 * auVar81._4_4_ | (uint)!bVar16 * auVar142._4_4_);
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            fVar129 = (float)((uint)bVar16 * auVar81._8_4_ | (uint)!bVar16 * auVar142._8_4_);
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            fVar131 = (float)((uint)bVar16 * auVar81._12_4_ | (uint)!bVar16 * auVar142._12_4_);
            auVar96 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar125))));
            auVar119._0_4_ =
                 (float)((uint)(bVar72 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar147._0_4_);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar16 * auVar90._4_4_ | (uint)!bVar16 * auVar147._4_4_);
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar16 * auVar90._8_4_ | (uint)!bVar16 * auVar147._8_4_);
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar16 * auVar90._12_4_ | (uint)!bVar16 * auVar147._12_4_);
            fVar140 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar90._16_4_);
            auVar119._16_4_ = fVar140;
            fVar132 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar90._20_4_);
            auVar119._20_4_ = fVar132;
            fVar146 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar90._24_4_);
            auVar119._24_4_ = fVar146;
            iVar1 = (uint)(byte)(uVar79 >> 7) * auVar90._28_4_;
            auVar119._28_4_ = iVar1;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar84),auVar95);
            auVar120._0_4_ =
                 (uint)(bVar72 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar83._0_4_;
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar120._4_4_ = (uint)bVar16 * auVar92._4_4_ | (uint)!bVar16 * auVar83._4_4_;
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar120._8_4_ = (uint)bVar16 * auVar92._8_4_ | (uint)!bVar16 * auVar83._8_4_;
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar120._12_4_ = (uint)bVar16 * auVar92._12_4_ | (uint)!bVar16 * auVar83._12_4_;
            auVar120._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * auVar92._16_4_;
            auVar120._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * auVar92._20_4_;
            auVar120._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * auVar92._24_4_;
            auVar120._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar92._28_4_;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar8));
            auVar121._0_4_ =
                 (float)((uint)(bVar72 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar186._0_4_);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar16 * auVar92._4_4_ | (uint)!bVar16 * auVar186._4_4_);
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar16 * auVar92._8_4_ | (uint)!bVar16 * auVar186._8_4_);
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar16 * auVar92._12_4_ | (uint)!bVar16 * auVar186._12_4_);
            fVar139 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar92._16_4_);
            auVar121._16_4_ = fVar139;
            fVar160 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar92._20_4_);
            auVar121._20_4_ = fVar160;
            fVar163 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar92._24_4_);
            auVar121._24_4_ = fVar163;
            auVar121._28_4_ = (uint)(byte)(uVar79 >> 7) * auVar92._28_4_;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar9));
            auVar122._0_4_ =
                 (float)((uint)(bVar72 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar72 & 1) * auVar81._0_4_);
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar16 * auVar92._4_4_ | (uint)!bVar16 * auVar81._4_4_);
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar16 * auVar92._8_4_ | (uint)!bVar16 * auVar81._8_4_);
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar16 * auVar92._12_4_ | (uint)!bVar16 * auVar81._12_4_);
            fVar159 = (float)((uint)((byte)(uVar79 >> 4) & 1) * auVar92._16_4_);
            auVar122._16_4_ = fVar159;
            fVar145 = (float)((uint)((byte)(uVar79 >> 5) & 1) * auVar92._20_4_);
            auVar122._20_4_ = fVar145;
            fVar162 = (float)((uint)((byte)(uVar79 >> 6) & 1) * auVar92._24_4_);
            auVar122._24_4_ = fVar162;
            iVar2 = (uint)(byte)(uVar79 >> 7) * auVar92._28_4_;
            auVar122._28_4_ = iVar2;
            auVar123._0_4_ =
                 (uint)(bVar72 & 1) * (int)auVar84._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar95._0_4_
            ;
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar123._4_4_ = (uint)bVar16 * (int)auVar84._4_4_ | (uint)!bVar16 * auVar95._4_4_;
            bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar123._8_4_ = (uint)bVar16 * (int)auVar84._8_4_ | (uint)!bVar16 * auVar95._8_4_;
            bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar123._12_4_ = (uint)bVar16 * (int)auVar84._12_4_ | (uint)!bVar16 * auVar95._12_4_;
            auVar123._16_4_ = (uint)!(bool)((byte)(uVar79 >> 4) & 1) * auVar95._16_4_;
            auVar123._20_4_ = (uint)!(bool)((byte)(uVar79 >> 5) & 1) * auVar95._20_4_;
            auVar123._24_4_ = (uint)!(bool)((byte)(uVar79 >> 6) & 1) * auVar95._24_4_;
            auVar123._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar95._28_4_;
            bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar79 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar79 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar79 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar95 = vsubps_avx512vl(auVar123,auVar103);
            auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar22._12_4_ |
                                                    (uint)!bVar20 * auVar8._12_4_,
                                                    CONCAT48((uint)bVar19 * (int)auVar22._8_4_ |
                                                             (uint)!bVar19 * auVar8._8_4_,
                                                             CONCAT44((uint)bVar16 *
                                                                      (int)auVar22._4_4_ |
                                                                      (uint)!bVar16 * auVar8._4_4_,
                                                                      (uint)(bVar72 & 1) *
                                                                      (int)auVar22._0_4_ |
                                                                      (uint)!(bool)(bVar72 & 1) *
                                                                      auVar8._0_4_)))),auVar96);
            auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar85._12_4_ |
                                                    (uint)!bVar21 * auVar9._12_4_,
                                                    CONCAT48((uint)bVar18 * (int)auVar85._8_4_ |
                                                             (uint)!bVar18 * auVar9._8_4_,
                                                             CONCAT44((uint)bVar17 *
                                                                      (int)auVar85._4_4_ |
                                                                      (uint)!bVar17 * auVar9._4_4_,
                                                                      (uint)(bVar72 & 1) *
                                                                      (int)auVar85._0_4_ |
                                                                      (uint)!(bool)(bVar72 & 1) *
                                                                      auVar9._0_4_)))),auVar119);
            auVar91 = vsubps_avx(auVar103,auVar120);
            auVar94 = vsubps_avx(auVar96,auVar121);
            auVar93 = vsubps_avx(auVar119,auVar122);
            auVar59._4_4_ = auVar90._4_4_ * fVar126;
            auVar59._0_4_ = auVar90._0_4_ * fVar80;
            auVar59._8_4_ = auVar90._8_4_ * fVar128;
            auVar59._12_4_ = auVar90._12_4_ * fVar130;
            auVar59._16_4_ = auVar90._16_4_ * 0.0;
            auVar59._20_4_ = auVar90._20_4_ * 0.0;
            auVar59._24_4_ = auVar90._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar59,auVar119,auVar95);
            auVar152._0_4_ = fVar125 * auVar95._0_4_;
            auVar152._4_4_ = fVar127 * auVar95._4_4_;
            auVar152._8_4_ = fVar129 * auVar95._8_4_;
            auVar152._12_4_ = fVar131 * auVar95._12_4_;
            auVar152._16_4_ = auVar95._16_4_ * 0.0;
            auVar152._20_4_ = auVar95._20_4_ * 0.0;
            auVar152._24_4_ = auVar95._24_4_ * 0.0;
            auVar152._28_4_ = 0;
            auVar186 = vfmsub231ps_fma(auVar152,auVar103,auVar89);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar186),auVar87,ZEXT1632(auVar83));
            auVar155._0_4_ = auVar89._0_4_ * auVar119._0_4_;
            auVar155._4_4_ = auVar89._4_4_ * auVar119._4_4_;
            auVar155._8_4_ = auVar89._8_4_ * auVar119._8_4_;
            auVar155._12_4_ = auVar89._12_4_ * auVar119._12_4_;
            auVar155._16_4_ = auVar89._16_4_ * fVar140;
            auVar155._20_4_ = auVar89._20_4_ * fVar132;
            auVar155._24_4_ = auVar89._24_4_ * fVar146;
            auVar155._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar155,auVar96,auVar90);
            auVar97 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar83));
            auVar92 = vmulps_avx512vl(auVar93,auVar120);
            auVar92 = vfmsub231ps_avx512vl(auVar92,auVar91,auVar122);
            auVar60._4_4_ = auVar94._4_4_ * auVar122._4_4_;
            auVar60._0_4_ = auVar94._0_4_ * auVar122._0_4_;
            auVar60._8_4_ = auVar94._8_4_ * auVar122._8_4_;
            auVar60._12_4_ = auVar94._12_4_ * auVar122._12_4_;
            auVar60._16_4_ = auVar94._16_4_ * fVar159;
            auVar60._20_4_ = auVar94._20_4_ * fVar145;
            auVar60._24_4_ = auVar94._24_4_ * fVar162;
            auVar60._28_4_ = iVar2;
            auVar83 = vfmsub231ps_fma(auVar60,auVar121,auVar93);
            auVar156._0_4_ = auVar121._0_4_ * auVar91._0_4_;
            auVar156._4_4_ = auVar121._4_4_ * auVar91._4_4_;
            auVar156._8_4_ = auVar121._8_4_ * auVar91._8_4_;
            auVar156._12_4_ = auVar121._12_4_ * auVar91._12_4_;
            auVar156._16_4_ = fVar139 * auVar91._16_4_;
            auVar156._20_4_ = fVar160 * auVar91._20_4_;
            auVar156._24_4_ = fVar163 * auVar91._24_4_;
            auVar156._28_4_ = 0;
            auVar186 = vfmsub231ps_fma(auVar156,auVar94,auVar120);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar186),auVar87,auVar92);
            auVar88 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar83));
            auVar92 = vmaxps_avx(auVar97,auVar88);
            uVar134 = vcmpps_avx512vl(auVar92,auVar87,2);
            bVar78 = bVar78 & (byte)uVar134;
            auVar192 = ZEXT3264(local_400);
            if (bVar78 != 0) {
              uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar177._4_4_ = uVar133;
              auVar177._0_4_ = uVar133;
              auVar177._8_4_ = uVar133;
              auVar177._12_4_ = uVar133;
              auVar177._16_4_ = uVar133;
              auVar177._20_4_ = uVar133;
              auVar177._24_4_ = uVar133;
              auVar177._28_4_ = uVar133;
              auVar178 = ZEXT3264(auVar177);
              auVar61._4_4_ = auVar93._4_4_ * auVar89._4_4_;
              auVar61._0_4_ = auVar93._0_4_ * auVar89._0_4_;
              auVar61._8_4_ = auVar93._8_4_ * auVar89._8_4_;
              auVar61._12_4_ = auVar93._12_4_ * auVar89._12_4_;
              auVar61._16_4_ = auVar93._16_4_ * auVar89._16_4_;
              auVar61._20_4_ = auVar93._20_4_ * auVar89._20_4_;
              auVar61._24_4_ = auVar93._24_4_ * auVar89._24_4_;
              auVar61._28_4_ = auVar92._28_4_;
              auVar81 = vfmsub231ps_fma(auVar61,auVar94,auVar90);
              auVar62._4_4_ = auVar90._4_4_ * auVar91._4_4_;
              auVar62._0_4_ = auVar90._0_4_ * auVar91._0_4_;
              auVar62._8_4_ = auVar90._8_4_ * auVar91._8_4_;
              auVar62._12_4_ = auVar90._12_4_ * auVar91._12_4_;
              auVar62._16_4_ = auVar90._16_4_ * auVar91._16_4_;
              auVar62._20_4_ = auVar90._20_4_ * auVar91._20_4_;
              auVar62._24_4_ = auVar90._24_4_ * auVar91._24_4_;
              auVar62._28_4_ = auVar90._28_4_;
              auVar186 = vfmsub231ps_fma(auVar62,auVar95,auVar93);
              auVar63._4_4_ = auVar94._4_4_ * auVar95._4_4_;
              auVar63._0_4_ = auVar94._0_4_ * auVar95._0_4_;
              auVar63._8_4_ = auVar94._8_4_ * auVar95._8_4_;
              auVar63._12_4_ = auVar94._12_4_ * auVar95._12_4_;
              auVar63._16_4_ = auVar94._16_4_ * auVar95._16_4_;
              auVar63._20_4_ = auVar94._20_4_ * auVar95._20_4_;
              auVar63._24_4_ = auVar94._24_4_ * auVar95._24_4_;
              auVar63._28_4_ = auVar94._28_4_;
              auVar8 = vfmsub231ps_fma(auVar63,auVar91,auVar89);
              auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar186),ZEXT1632(auVar8));
              auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar81),auVar87);
              auVar89 = vrcp14ps_avx512vl(auVar92);
              auVar91 = auVar190._0_32_;
              auVar90 = vfnmadd213ps_avx512vl(auVar89,auVar92,auVar91);
              auVar83 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
              auVar64._4_4_ = auVar8._4_4_ * auVar119._4_4_;
              auVar64._0_4_ = auVar8._0_4_ * auVar119._0_4_;
              auVar64._8_4_ = auVar8._8_4_ * auVar119._8_4_;
              auVar64._12_4_ = auVar8._12_4_ * auVar119._12_4_;
              auVar64._16_4_ = fVar140 * 0.0;
              auVar64._20_4_ = fVar132 * 0.0;
              auVar64._24_4_ = fVar146 * 0.0;
              auVar64._28_4_ = iVar1;
              auVar186 = vfmadd231ps_fma(auVar64,auVar96,ZEXT1632(auVar186));
              auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar103,ZEXT1632(auVar81));
              fVar140 = auVar83._0_4_;
              fVar132 = auVar83._4_4_;
              fVar146 = auVar83._8_4_;
              fVar139 = auVar83._12_4_;
              local_260 = ZEXT1632(CONCAT412(auVar186._12_4_ * fVar139,
                                             CONCAT48(auVar186._8_4_ * fVar146,
                                                      CONCAT44(auVar186._4_4_ * fVar132,
                                                               auVar186._0_4_ * fVar140))));
              uVar134 = vcmpps_avx512vl(local_260,auVar177,2);
              auVar71._4_4_ = uStack_37c;
              auVar71._0_4_ = local_380;
              auVar71._8_4_ = uStack_378;
              auVar71._12_4_ = uStack_374;
              auVar71._16_4_ = uStack_370;
              auVar71._20_4_ = uStack_36c;
              auVar71._24_4_ = uStack_368;
              auVar71._28_4_ = uStack_364;
              uVar24 = vcmpps_avx512vl(local_260,auVar71,0xd);
              bVar78 = (byte)uVar134 & (byte)uVar24 & bVar78;
              if (bVar78 != 0) {
                uVar134 = vcmpps_avx512vl(auVar92,auVar87,4);
                bVar78 = bVar78 & (byte)uVar134;
                auVar167 = ZEXT1664(local_600);
                auVar182 = ZEXT3264(local_580);
                if (bVar78 != 0) {
                  fVar160 = auVar97._0_4_ * fVar140;
                  fVar163 = auVar97._4_4_ * fVar132;
                  auVar65._4_4_ = fVar163;
                  auVar65._0_4_ = fVar160;
                  fVar159 = auVar97._8_4_ * fVar146;
                  auVar65._8_4_ = fVar159;
                  fVar162 = auVar97._12_4_ * fVar139;
                  auVar65._12_4_ = fVar162;
                  fVar145 = auVar97._16_4_ * 0.0;
                  auVar65._16_4_ = fVar145;
                  fVar80 = auVar97._20_4_ * 0.0;
                  auVar65._20_4_ = fVar80;
                  fVar125 = auVar97._24_4_ * 0.0;
                  auVar65._24_4_ = fVar125;
                  auVar65._28_4_ = auVar92._28_4_;
                  auVar89 = vsubps_avx512vl(auVar91,auVar65);
                  local_2a0._0_4_ =
                       (float)((uint)(bVar72 & 1) * (int)fVar160 |
                              (uint)!(bool)(bVar72 & 1) * auVar89._0_4_);
                  bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                  local_2a0._4_4_ =
                       (float)((uint)bVar16 * (int)fVar163 | (uint)!bVar16 * auVar89._4_4_);
                  bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
                  local_2a0._8_4_ =
                       (float)((uint)bVar16 * (int)fVar159 | (uint)!bVar16 * auVar89._8_4_);
                  bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
                  local_2a0._12_4_ =
                       (float)((uint)bVar16 * (int)fVar162 | (uint)!bVar16 * auVar89._12_4_);
                  bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                  local_2a0._16_4_ =
                       (float)((uint)bVar16 * (int)fVar145 | (uint)!bVar16 * auVar89._16_4_);
                  bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
                  local_2a0._20_4_ =
                       (float)((uint)bVar16 * (int)fVar80 | (uint)!bVar16 * auVar89._20_4_);
                  bVar16 = (bool)((byte)(uVar79 >> 6) & 1);
                  local_2a0._24_4_ =
                       (float)((uint)bVar16 * (int)fVar125 | (uint)!bVar16 * auVar89._24_4_);
                  bVar16 = SUB81(uVar79 >> 7,0);
                  local_2a0._28_4_ =
                       (float)((uint)bVar16 * auVar92._28_4_ | (uint)!bVar16 * auVar89._28_4_);
                  auVar92 = vsubps_avx(ZEXT1632(auVar82),auVar98);
                  auVar83 = vfmadd213ps_fma(auVar92,local_2a0,auVar98);
                  uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                  auVar30._4_4_ = uVar133;
                  auVar30._0_4_ = uVar133;
                  auVar30._8_4_ = uVar133;
                  auVar30._12_4_ = uVar133;
                  auVar30._16_4_ = uVar133;
                  auVar30._20_4_ = uVar133;
                  auVar30._24_4_ = uVar133;
                  auVar30._28_4_ = uVar133;
                  auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                               CONCAT48(auVar83._8_4_ +
                                                                        auVar83._8_4_,
                                                                        CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                            auVar30);
                  uVar134 = vcmpps_avx512vl(local_260,auVar92,6);
                  if (((byte)uVar134 & bVar78) != 0) {
                    auVar141._0_4_ = auVar88._0_4_ * fVar140;
                    auVar141._4_4_ = auVar88._4_4_ * fVar132;
                    auVar141._8_4_ = auVar88._8_4_ * fVar146;
                    auVar141._12_4_ = auVar88._12_4_ * fVar139;
                    auVar141._16_4_ = auVar88._16_4_ * 0.0;
                    auVar141._20_4_ = auVar88._20_4_ * 0.0;
                    auVar141._24_4_ = auVar88._24_4_ * 0.0;
                    auVar141._28_4_ = 0;
                    auVar92 = vsubps_avx512vl(auVar91,auVar141);
                    auVar124._0_4_ =
                         (uint)(bVar72 & 1) * (int)auVar141._0_4_ |
                         (uint)!(bool)(bVar72 & 1) * auVar92._0_4_;
                    bVar16 = (bool)((byte)(uVar79 >> 1) & 1);
                    auVar124._4_4_ =
                         (uint)bVar16 * (int)auVar141._4_4_ | (uint)!bVar16 * auVar92._4_4_;
                    bVar16 = (bool)((byte)(uVar79 >> 2) & 1);
                    auVar124._8_4_ =
                         (uint)bVar16 * (int)auVar141._8_4_ | (uint)!bVar16 * auVar92._8_4_;
                    bVar16 = (bool)((byte)(uVar79 >> 3) & 1);
                    auVar124._12_4_ =
                         (uint)bVar16 * (int)auVar141._12_4_ | (uint)!bVar16 * auVar92._12_4_;
                    bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                    auVar124._16_4_ =
                         (uint)bVar16 * (int)auVar141._16_4_ | (uint)!bVar16 * auVar92._16_4_;
                    bVar16 = (bool)((byte)(uVar79 >> 5) & 1);
                    auVar124._20_4_ =
                         (uint)bVar16 * (int)auVar141._20_4_ | (uint)!bVar16 * auVar92._20_4_;
                    bVar16 = (bool)((byte)(uVar79 >> 6) & 1);
                    auVar124._24_4_ =
                         (uint)bVar16 * (int)auVar141._24_4_ | (uint)!bVar16 * auVar92._24_4_;
                    auVar124._28_4_ = (uint)!SUB81(uVar79 >> 7,0) * auVar92._28_4_;
                    auVar31._8_4_ = 0x40000000;
                    auVar31._0_8_ = 0x4000000040000000;
                    auVar31._12_4_ = 0x40000000;
                    auVar31._16_4_ = 0x40000000;
                    auVar31._20_4_ = 0x40000000;
                    auVar31._24_4_ = 0x40000000;
                    auVar31._28_4_ = 0x40000000;
                    local_280 = vfmsub132ps_avx512vl(auVar124,auVar91,auVar31);
                    local_240 = (undefined4)lVar75;
                    local_230 = local_600;
                    local_220 = local_5e0;
                    uStack_218 = uStack_5d8;
                    local_210 = local_5f0;
                    uStack_208 = uStack_5e8;
                    pGVar14 = (context->scene->geometries).items[local_608].ptr;
                    if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar72 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar72 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar83 = vcvtsi2ss_avx512f(auVar100._0_16_,local_240);
                      fVar140 = auVar83._0_4_;
                      local_1e0[0] = (fVar140 + local_2a0._0_4_ + 0.0) * (float)local_2c0;
                      local_1e0[1] = (fVar140 + local_2a0._4_4_ + 1.0) * local_2c0._4_4_;
                      local_1e0[2] = (fVar140 + local_2a0._8_4_ + 2.0) * fStack_2b8;
                      local_1e0[3] = (fVar140 + local_2a0._12_4_ + 3.0) * fStack_2b4;
                      fStack_1d0 = (fVar140 + local_2a0._16_4_ + 4.0) * fStack_2b0;
                      fStack_1cc = (fVar140 + local_2a0._20_4_ + 5.0) * fStack_2ac;
                      fStack_1c8 = (fVar140 + local_2a0._24_4_ + 6.0) * fStack_2a8;
                      fStack_1c4 = fVar140 + local_2a0._28_4_ + 7.0;
                      local_1c0 = local_280;
                      local_1a0 = local_260;
                      uVar79 = CONCAT71(0,(byte)uVar134 & bVar78);
                      local_420._0_8_ = uVar79;
                      lVar26 = 0;
                      for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                        lVar26 = lVar26 + 1;
                      }
                      local_5c0._0_8_ = lVar26;
                      local_180 = auVar177;
                      local_5d0._0_8_ = pGVar14;
                      local_23c = iVar13;
                      do {
                        auVar186 = auVar187._0_16_;
                        local_320 = local_1e0[local_5c0._0_8_];
                        local_310 = *(undefined4 *)(local_1c0 + local_5c0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1a0 + local_5c0._0_8_ * 4);
                        local_5b0.context = context->user;
                        fVar132 = 1.0 - local_320;
                        fVar140 = fVar132 * fVar132 * -3.0;
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                                  ZEXT416((uint)(local_320 * fVar132)),
                                                  ZEXT416(0xc0000000));
                        auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_320 * fVar132)),
                                                  ZEXT416((uint)(local_320 * local_320)),
                                                  ZEXT416(0x40000000));
                        fVar132 = auVar83._0_4_ * 3.0;
                        fVar146 = auVar82._0_4_ * 3.0;
                        fVar139 = local_320 * local_320 * 3.0;
                        auVar158._0_4_ = fVar139 * local_530;
                        auVar158._4_4_ = fVar139 * fStack_52c;
                        auVar158._8_4_ = fVar139 * fStack_528;
                        auVar158._12_4_ = fVar139 * fStack_524;
                        auVar137._4_4_ = fVar146;
                        auVar137._0_4_ = fVar146;
                        auVar137._8_4_ = fVar146;
                        auVar137._12_4_ = fVar146;
                        auVar67._8_8_ = uStack_5e8;
                        auVar67._0_8_ = local_5f0;
                        auVar83 = vfmadd132ps_fma(auVar137,auVar158,auVar67);
                        auVar149._4_4_ = fVar132;
                        auVar149._0_4_ = fVar132;
                        auVar149._8_4_ = fVar132;
                        auVar149._12_4_ = fVar132;
                        auVar69._8_8_ = uStack_5d8;
                        auVar69._0_8_ = local_5e0;
                        auVar83 = vfmadd132ps_fma(auVar149,auVar83,auVar69);
                        auVar138._4_4_ = fVar140;
                        auVar138._0_4_ = fVar140;
                        auVar138._8_4_ = fVar140;
                        auVar138._12_4_ = fVar140;
                        auVar83 = vfmadd213ps_fma(auVar138,auVar167._0_16_,auVar83);
                        local_350 = auVar83._0_4_;
                        local_340 = vshufps_avx(auVar83,auVar83,0x55);
                        local_330 = vshufps_avx(auVar83,auVar83,0xaa);
                        local_300 = local_540._0_8_;
                        uStack_2f8 = local_540._8_8_;
                        local_2f0 = local_550;
                        vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                        uStack_2dc = (local_5b0.context)->instID[0];
                        local_2e0 = uStack_2dc;
                        uStack_2d8 = uStack_2dc;
                        uStack_2d4 = uStack_2dc;
                        uStack_2d0 = (local_5b0.context)->instPrimID[0];
                        uStack_2cc = uStack_2d0;
                        uStack_2c8 = uStack_2d0;
                        uStack_2c4 = uStack_2d0;
                        local_620 = local_390;
                        local_5b0.valid = (int *)local_620;
                        local_5b0.geometryUserPtr = *(void **)(local_5d0._0_8_ + 0x18);
                        local_5b0.hit = (RTCHitN *)&local_350;
                        local_5b0.N = 4;
                        local_5b0.ray = (RTCRayN *)ray;
                        uStack_34c = local_350;
                        uStack_348 = local_350;
                        uStack_344 = local_350;
                        fStack_31c = local_320;
                        fStack_318 = local_320;
                        fStack_314 = local_320;
                        uStack_30c = local_310;
                        uStack_308 = local_310;
                        uStack_304 = local_310;
                        if (*(code **)(local_5d0._0_8_ + 0x48) != (code *)0x0) {
                          (**(code **)(local_5d0._0_8_ + 0x48))(&local_5b0);
                          auVar178 = ZEXT3264(local_180);
                          auVar182 = ZEXT3264(local_580);
                          auVar192 = ZEXT3264(local_400);
                          auVar185 = ZEXT3264(local_440);
                          auVar184 = ZEXT3264(local_3e0);
                          auVar183 = ZEXT3264(local_3c0);
                          auVar167 = ZEXT1664(local_600);
                          auVar83 = vxorps_avx512vl(auVar186,auVar186);
                          auVar187 = ZEXT1664(auVar83);
                          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar190 = ZEXT3264(auVar92);
                        }
                        auVar83 = auVar187._0_16_;
                        uVar79 = vptestmd_avx512vl(local_620,local_620);
                        if ((uVar79 & 0xf) == 0) {
                          auVar188 = ZEXT3264(local_4c0);
                          auVar191 = ZEXT3264(local_4e0);
                          auVar189 = ZEXT3264(local_500);
                        }
                        else {
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_5d0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            (*p_Var15)(&local_5b0);
                            auVar178 = ZEXT3264(local_180);
                            auVar182 = ZEXT3264(local_580);
                            auVar192 = ZEXT3264(local_400);
                            auVar185 = ZEXT3264(local_440);
                            auVar184 = ZEXT3264(local_3e0);
                            auVar183 = ZEXT3264(local_3c0);
                            auVar167 = ZEXT1664(local_600);
                            auVar83 = vxorps_avx512vl(auVar83,auVar83);
                            auVar187 = ZEXT1664(auVar83);
                            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar190 = ZEXT3264(auVar92);
                          }
                          uVar79 = vptestmd_avx512vl(local_620,local_620);
                          uVar79 = uVar79 & 0xf;
                          auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar16 = (bool)((byte)uVar79 & 1);
                          bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar79 >> 2) & 1);
                          bVar18 = SUB81(uVar79 >> 3,0);
                          *(uint *)(local_5b0.ray + 0x80) =
                               (uint)bVar16 * auVar83._0_4_ |
                               (uint)!bVar16 * *(int *)(local_5b0.ray + 0x80);
                          *(uint *)(local_5b0.ray + 0x84) =
                               (uint)bVar17 * auVar83._4_4_ |
                               (uint)!bVar17 * *(int *)(local_5b0.ray + 0x84);
                          *(uint *)(local_5b0.ray + 0x88) =
                               (uint)bVar19 * auVar83._8_4_ |
                               (uint)!bVar19 * *(int *)(local_5b0.ray + 0x88);
                          *(uint *)(local_5b0.ray + 0x8c) =
                               (uint)bVar18 * auVar83._12_4_ |
                               (uint)!bVar18 * *(int *)(local_5b0.ray + 0x8c);
                          auVar188 = ZEXT3264(local_4c0);
                          auVar191 = ZEXT3264(local_4e0);
                          auVar189 = ZEXT3264(local_500);
                          if ((byte)uVar79 != 0) {
                            bVar72 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x80) = auVar178._0_4_;
                        uVar73 = local_420._0_8_ ^ 1L << (local_5c0._0_8_ & 0x3f);
                        bVar72 = 0;
                        local_420._0_8_ = uVar73;
                        lVar26 = 0;
                        for (uVar79 = uVar73; (uVar79 & 1) == 0;
                            uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                          lVar26 = lVar26 + 1;
                        }
                        local_5c0._0_8_ = lVar26;
                      } while (uVar73 != 0);
                    }
                    bVar74 = (bool)(bVar74 | bVar72);
                  }
                }
                goto LAB_01d5d315;
              }
            }
            auVar182 = ZEXT3264(local_580);
          }
LAB_01d5d315:
          lVar75 = lVar75 + 8;
        } while ((int)lVar75 < iVar13);
      }
      if (bVar74) {
        return bVar74;
      }
      uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar29._4_4_ = uVar133;
      auVar29._0_4_ = uVar133;
      auVar29._8_4_ = uVar133;
      auVar29._12_4_ = uVar133;
      auVar29._16_4_ = uVar133;
      auVar29._20_4_ = uVar133;
      auVar29._24_4_ = uVar133;
      auVar29._28_4_ = uVar133;
      uVar134 = vcmpps_avx512vl(local_80,auVar29,2);
      uVar76 = (uint)uVar77 & (uint)uVar134;
      uVar77 = (ulong)uVar76;
    } while (uVar76 != 0);
  }
  return bVar74;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }